

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_16777232,_true,_embree::sse42::SubGridMBIntersector1Pluecker<4,_true>_>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar16;
  ushort uVar17;
  ushort uVar18;
  undefined8 uVar19;
  Geometry *pGVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  RTCIntersectArguments *pRVar25;
  RTCRayQueryContext *pRVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 (*pauVar44) [16];
  undefined4 uVar45;
  int iVar46;
  AABBNodeMB4D *node1;
  ulong uVar47;
  long lVar48;
  RayHit *pRVar49;
  int iVar50;
  undefined1 auVar51 [8];
  ulong uVar52;
  long lVar53;
  undefined1 auVar54 [8];
  ulong uVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  ulong uVar59;
  long lVar60;
  byte bVar61;
  byte bVar81;
  byte bVar82;
  byte bVar83;
  byte bVar84;
  float fVar85;
  byte bVar86;
  byte bVar87;
  float fVar88;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar89;
  uint uVar90;
  uint uVar107;
  uint uVar108;
  vint4 ai;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  uint uVar109;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar110;
  uint uVar111;
  uint uVar117;
  uint uVar118;
  vint4 ai_2;
  undefined1 auVar112 [16];
  uint uVar119;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  uint uVar120;
  uint uVar133;
  uint uVar134;
  vint4 bi;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  uint uVar135;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar145;
  vint4 ai_5;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar152;
  float fVar153;
  vint4 ai_1;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar154;
  uint uVar155;
  float fVar159;
  uint uVar161;
  vint4 bi_1;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  uint uVar160;
  uint uVar162;
  undefined1 auVar158 [16];
  float fVar163;
  float fVar169;
  float fVar171;
  float fVar173;
  vint4 ai_7;
  float fVar164;
  float fVar174;
  undefined1 auVar165 [16];
  float fVar170;
  float fVar172;
  float fVar175;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar181 [16];
  float fVar192;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar207;
  float fVar209;
  float fVar210;
  float fVar211;
  undefined1 auVar208 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar217;
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  vint4 bi_2;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_13c9;
  undefined1 (*local_13c8) [16];
  RayQueryContext *local_13c0;
  undefined1 local_13b4 [12];
  undefined1 local_13a8 [4];
  undefined1 auStack_13a4 [8];
  float fStack_139c;
  ulong local_1390;
  undefined1 local_1388 [8];
  float fStack_1380;
  float fStack_137c;
  undefined1 local_1378 [8];
  float fStack_1370;
  float fStack_136c;
  uint local_1368 [1];
  uint auStack_1364 [1];
  float fStack_1360;
  float fStack_135c;
  undefined1 local_1358 [8];
  float fStack_1350;
  float fStack_134c;
  undefined1 local_1348 [8];
  float fStack_1340;
  float fStack_133c;
  undefined1 local_1338 [8];
  uint uStack_1330;
  uint uStack_132c;
  long local_1320;
  RTCFilterFunctionNArguments local_1318;
  float local_12e8;
  undefined4 local_12e4;
  undefined4 local_12e0;
  undefined4 local_12dc;
  float local_12d8;
  undefined4 local_12d4;
  float local_12d0;
  uint local_12cc;
  uint local_12c8;
  undefined1 local_12b8 [8];
  float fStack_12b0;
  float fStack_12ac;
  undefined8 local_12a8;
  float fStack_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  ulong local_1290;
  undefined1 local_1288 [8];
  float fStack_1280;
  float fStack_127c;
  undefined1 local_1278 [8];
  float fStack_1270;
  float fStack_126c;
  undefined1 local_1268 [16];
  undefined1 *local_1258;
  undefined1 local_1248 [16];
  undefined1 local_1238 [16];
  undefined1 local_1228 [16];
  float local_1218 [4];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  undefined1 local_11d8 [16];
  undefined1 local_11c8 [16];
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  undefined1 local_1198 [8];
  float fStack_1190;
  float fStack_118c;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  undefined1 local_1178 [16];
  undefined8 local_1168;
  float fStack_1160;
  float fStack_115c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  undefined8 local_1148;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  long local_1110;
  ulong local_1108;
  ulong local_1100;
  ulong local_10f8;
  ulong local_10f0;
  ulong local_10e8;
  ulong local_10e0;
  long local_10d8;
  ulong local_10d0;
  Scene *local_10c8;
  long local_10c0;
  ulong local_10b8;
  ulong local_10b0;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined1 local_1078 [16];
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  undefined1 local_1058 [8];
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [8];
  float fStack_1030;
  float fStack_102c;
  uint local_1028;
  uint uStack_1024;
  uint uStack_1020;
  uint uStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [16];
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_13c8 = (undefined1 (*) [16])local_f68;
      local_11a8 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_11b8 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_1068 = (ray->super_RayK<1>).org.field_0.m128[2];
      aVar16 = (ray->super_RayK<1>).dir.field_0.field_1;
      fVar145 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fVar175 = 0.0;
      if (0.0 <= fVar145) {
        fVar175 = fVar145;
      }
      fVar145 = (ray->super_RayK<1>).tfar;
      fVar192 = 0.0;
      if (0.0 <= fVar145) {
        fVar192 = fVar145;
      }
      auVar137._4_4_ = -(uint)(ABS(aVar16.y) < 1e-18);
      auVar137._0_4_ = -(uint)(ABS(aVar16.x) < 1e-18);
      auVar137._8_4_ = -(uint)(ABS(aVar16.z) < 1e-18);
      auVar137._12_4_ = -(uint)(ABS(aVar16.field_3.w) < 1e-18);
      auVar136 = divps(_DAT_01feca10,(undefined1  [16])aVar16);
      auVar137 = blendvps(auVar136,_DAT_0201c930,auVar137);
      local_1088 = auVar137._0_4_ * 0.99999964;
      local_1098 = auVar137._4_4_ * 0.99999964;
      local_1048 = auVar137._8_4_ * 0.99999964;
      local_10a8 = auVar137._0_4_ * 1.0000004;
      fVar145 = auVar137._4_4_ * 1.0000004;
      fStack_1030 = auVar137._8_4_ * 1.0000004;
      fStack_1044 = local_1048;
      fStack_1040 = local_1048;
      fStack_103c = local_1048;
      local_1058._4_4_ = fVar145;
      local_1058._0_4_ = fVar145;
      fStack_1050 = fVar145;
      fStack_104c = fVar145;
      local_10e0 = (ulong)(local_1088 < 0.0) << 4;
      local_1038._4_4_ = fStack_1030;
      local_1038._0_4_ = fStack_1030;
      fStack_102c = fStack_1030;
      local_10e8 = (ulong)(local_1098 < 0.0) << 4 | 0x20;
      local_10f0 = (ulong)(local_1048 < 0.0) << 4 | 0x40;
      local_10f8 = local_10e0 ^ 0x10;
      local_1100 = local_10e8 ^ 0x10;
      local_1108 = local_10f0 ^ 0x10;
      local_1078._4_4_ = fVar175;
      local_1078._0_4_ = fVar175;
      local_1078._8_4_ = fVar175;
      local_1078._12_4_ = fVar175;
      local_1198._4_4_ = fVar192;
      local_1198._0_4_ = fVar192;
      fStack_1190 = fVar192;
      fStack_118c = fVar192;
      _local_1028 = mm_lookupmask_ps._240_8_;
      _uStack_1020 = mm_lookupmask_ps._248_8_;
      fStack_11a4 = local_11a8;
      fStack_11a0 = local_11a8;
      fStack_119c = local_11a8;
      fStack_11b4 = local_11b8;
      fStack_11b0 = local_11b8;
      fStack_11ac = local_11b8;
      local_13b4._4_8_ = ray;
      fStack_1064 = local_1068;
      fStack_1060 = local_1068;
      fStack_105c = local_1068;
      fStack_1084 = local_1088;
      fStack_1080 = local_1088;
      fStack_107c = local_1088;
      fStack_1094 = local_1098;
      fStack_1090 = local_1098;
      fStack_108c = local_1098;
      fStack_10a4 = local_10a8;
      fStack_10a0 = local_10a8;
      fStack_109c = local_10a8;
      auVar137 = local_1078;
      fVar145 = local_1098;
      fVar175 = local_1098;
      fVar192 = local_1098;
      fVar89 = local_1098;
      fVar154 = local_10a8;
      fVar159 = local_10a8;
      fVar173 = local_10a8;
      fVar176 = local_10a8;
      fVar85 = local_1068;
      fVar88 = local_1068;
      fVar177 = local_1068;
      fVar182 = local_1068;
      fVar186 = local_11a8;
      fVar110 = local_11a8;
      fVar163 = local_11a8;
      fVar169 = local_11a8;
      fVar171 = local_11b8;
      fVar190 = local_11b8;
      fVar152 = local_11b8;
      fVar153 = local_11b8;
      fVar174 = local_1088;
      fVar164 = local_1088;
      fVar170 = local_1088;
      fVar172 = local_1088;
      local_13c0 = context;
      do {
        do {
          do {
            if (local_13c8 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar44 = local_13c8 + -1;
            local_13c8 = local_13c8 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar44 + 8));
          uVar52 = *(ulong *)*local_13c8;
          do {
            if ((uVar52 & 8) == 0) {
              fVar178 = (ray->super_RayK<1>).dir.field_0.m128[3];
              uVar47 = uVar52 & 0xfffffffffffffff0;
              pfVar13 = (float *)(uVar47 + 0x80 + local_10e0);
              pfVar12 = (float *)(uVar47 + 0x20 + local_10e0);
              auVar139._0_4_ = ((*pfVar13 * fVar178 + *pfVar12) - fVar186) * fVar174;
              auVar139._4_4_ = ((pfVar13[1] * fVar178 + pfVar12[1]) - fVar110) * fVar164;
              auVar139._8_4_ = ((pfVar13[2] * fVar178 + pfVar12[2]) - fVar163) * fVar170;
              auVar139._12_4_ = ((pfVar13[3] * fVar178 + pfVar12[3]) - fVar169) * fVar172;
              pfVar14 = (float *)(uVar47 + 0x80 + local_10e8);
              pfVar12 = (float *)(uVar47 + 0x20 + local_10e8);
              pfVar15 = (float *)(uVar47 + 0x80 + local_10f0);
              pfVar13 = (float *)(uVar47 + 0x20 + local_10f0);
              auVar157._0_4_ = ((*pfVar14 * fVar178 + *pfVar12) - fVar171) * fVar145;
              auVar157._4_4_ = ((pfVar14[1] * fVar178 + pfVar12[1]) - fVar190) * fVar175;
              auVar157._8_4_ = ((pfVar14[2] * fVar178 + pfVar12[2]) - fVar152) * fVar192;
              auVar157._12_4_ = ((pfVar14[3] * fVar178 + pfVar12[3]) - fVar153) * fVar89;
              auVar136._0_4_ = ((*pfVar15 * fVar178 + *pfVar13) - fVar85) * local_1048;
              auVar136._4_4_ = ((pfVar15[1] * fVar178 + pfVar13[1]) - fVar88) * fStack_1044;
              auVar136._8_4_ = ((pfVar15[2] * fVar178 + pfVar13[2]) - fVar177) * fStack_1040;
              auVar136._12_4_ = ((pfVar15[3] * fVar178 + pfVar13[3]) - fVar182) * fStack_103c;
              auVar121 = maxps(auVar157,auVar136);
              auVar136 = maxps(auVar137,auVar139);
              _local_1288 = maxps(auVar136,auVar121);
              pfVar14 = (float *)(uVar47 + 0x80 + local_10f8);
              pfVar12 = (float *)(uVar47 + 0x20 + local_10f8);
              pfVar15 = (float *)(uVar47 + 0x80 + local_1100);
              pfVar13 = (float *)(uVar47 + 0x20 + local_1100);
              auVar168._0_4_ = ((*pfVar14 * fVar178 + *pfVar12) - fVar186) * fVar154;
              auVar168._4_4_ = ((pfVar14[1] * fVar178 + pfVar12[1]) - fVar110) * fVar159;
              auVar168._8_4_ = ((pfVar14[2] * fVar178 + pfVar12[2]) - fVar163) * fVar173;
              auVar168._12_4_ = ((pfVar14[3] * fVar178 + pfVar12[3]) - fVar169) * fVar176;
              auVar138._0_4_ = ((*pfVar15 * fVar178 + *pfVar13) - fVar171) * (float)local_1058._0_4_
              ;
              auVar138._4_4_ =
                   ((pfVar15[1] * fVar178 + pfVar13[1]) - fVar190) * (float)local_1058._4_4_;
              auVar138._8_4_ = ((pfVar15[2] * fVar178 + pfVar13[2]) - fVar152) * fStack_1050;
              auVar138._12_4_ = ((pfVar15[3] * fVar178 + pfVar13[3]) - fVar153) * fStack_104c;
              pfVar13 = (float *)(uVar47 + 0x80 + local_1108);
              pfVar12 = (float *)(uVar47 + 0x20 + local_1108);
              auVar121._0_4_ = ((*pfVar13 * fVar178 + *pfVar12) - fVar85) * (float)local_1038._0_4_;
              auVar121._4_4_ =
                   ((pfVar13[1] * fVar178 + pfVar12[1]) - fVar88) * (float)local_1038._4_4_;
              auVar121._8_4_ = ((pfVar13[2] * fVar178 + pfVar12[2]) - fVar177) * fStack_1030;
              auVar121._12_4_ = ((pfVar13[3] * fVar178 + pfVar12[3]) - fVar182) * fStack_102c;
              auVar139 = minps(auVar138,auVar121);
              auVar136 = minps(_local_1198,auVar168);
              auVar136 = minps(auVar136,auVar139);
              if (((uint)uVar52 & 7) == 6) {
                bVar27 = (fVar178 < *(float *)(uVar47 + 0xf0) &&
                         *(float *)(uVar47 + 0xe0) <= fVar178) && local_1288._0_4_ <= auVar136._0_4_
                ;
                bVar28 = (fVar178 < *(float *)(uVar47 + 0xf4) &&
                         *(float *)(uVar47 + 0xe4) <= fVar178) && local_1288._4_4_ <= auVar136._4_4_
                ;
                bVar29 = (fVar178 < *(float *)(uVar47 + 0xf8) &&
                         *(float *)(uVar47 + 0xe8) <= fVar178) && local_1288._8_4_ <= auVar136._8_4_
                ;
                bVar30 = (fVar178 < *(float *)(uVar47 + 0xfc) &&
                         *(float *)(uVar47 + 0xec) <= fVar178) &&
                         local_1288._12_4_ <= auVar136._12_4_;
              }
              else {
                bVar27 = local_1288._0_4_ <= auVar136._0_4_;
                bVar28 = local_1288._4_4_ <= auVar136._4_4_;
                bVar29 = local_1288._8_4_ <= auVar136._8_4_;
                bVar30 = local_1288._12_4_ <= auVar136._12_4_;
              }
              auVar62._0_4_ = (uint)bVar27 * -0x80000000;
              auVar62._4_4_ = (uint)bVar28 * -0x80000000;
              auVar62._8_4_ = (uint)bVar29 * -0x80000000;
              auVar62._12_4_ = (uint)bVar30 * -0x80000000;
              uVar45 = movmskps((int)uVar47,auVar62);
              local_10d0 = CONCAT44((int)(uVar47 >> 0x20),uVar45);
            }
            if ((uVar52 & 8) == 0) {
              if (local_10d0 == 0) {
                iVar46 = 4;
              }
              else {
                uVar47 = uVar52 & 0xfffffffffffffff0;
                lVar58 = 0;
                if (local_10d0 != 0) {
                  for (; (local_10d0 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                  }
                }
                iVar46 = 0;
                uVar52 = *(ulong *)(uVar47 + lVar58 * 8);
                uVar55 = local_10d0 - 1 & local_10d0;
                if (uVar55 != 0) {
                  uVar90 = *(uint *)(local_1288 + lVar58 * 4);
                  lVar58 = 0;
                  if (uVar55 != 0) {
                    for (; (uVar55 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                    }
                  }
                  uVar59 = *(ulong *)(uVar47 + lVar58 * 8);
                  uVar107 = *(uint *)(local_1288 + lVar58 * 4);
                  uVar55 = uVar55 - 1 & uVar55;
                  if (uVar55 == 0) {
                    if (uVar90 < uVar107) {
                      *(ulong *)*local_13c8 = uVar59;
                      *(uint *)((long)*local_13c8 + 8) = uVar107;
                      local_13c8 = local_13c8 + 1;
                    }
                    else {
                      *(ulong *)*local_13c8 = uVar52;
                      *(uint *)((long)*local_13c8 + 8) = uVar90;
                      uVar52 = uVar59;
                      local_13c8 = local_13c8 + 1;
                    }
                  }
                  else {
                    auVar91._8_4_ = uVar90;
                    auVar91._0_8_ = uVar52;
                    auVar91._12_4_ = 0;
                    auVar122._8_4_ = uVar107;
                    auVar122._0_8_ = uVar59;
                    auVar122._12_4_ = 0;
                    lVar58 = 0;
                    if (uVar55 != 0) {
                      for (; (uVar55 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                      }
                    }
                    uVar19 = *(undefined8 *)(uVar47 + lVar58 * 8);
                    iVar50 = *(int *)(local_1288 + lVar58 * 4);
                    auVar112._8_4_ = iVar50;
                    auVar112._0_8_ = uVar19;
                    auVar112._12_4_ = 0;
                    auVar63._8_4_ = -(uint)((int)uVar90 < (int)uVar107);
                    uVar55 = uVar55 - 1 & uVar55;
                    if (uVar55 == 0) {
                      auVar63._4_4_ = auVar63._8_4_;
                      auVar63._0_4_ = auVar63._8_4_;
                      auVar63._12_4_ = auVar63._8_4_;
                      auVar140._8_4_ = uVar107;
                      auVar140._0_8_ = uVar59;
                      auVar140._12_4_ = 0;
                      auVar139 = blendvps(auVar140,auVar91,auVar63);
                      auVar136 = blendvps(auVar91,auVar122,auVar63);
                      auVar64._8_4_ = -(uint)(auVar139._8_4_ < iVar50);
                      auVar64._4_4_ = auVar64._8_4_;
                      auVar64._0_4_ = auVar64._8_4_;
                      auVar64._12_4_ = auVar64._8_4_;
                      auVar123._8_4_ = iVar50;
                      auVar123._0_8_ = uVar19;
                      auVar123._12_4_ = 0;
                      auVar121 = blendvps(auVar123,auVar139,auVar64);
                      auVar157 = blendvps(auVar139,auVar112,auVar64);
                      auVar65._8_4_ = -(uint)(auVar136._8_4_ < auVar157._8_4_);
                      auVar65._4_4_ = auVar65._8_4_;
                      auVar65._0_4_ = auVar65._8_4_;
                      auVar65._12_4_ = auVar65._8_4_;
                      auVar139 = blendvps(auVar157,auVar136,auVar65);
                      auVar136 = blendvps(auVar136,auVar157,auVar65);
                      *local_13c8 = auVar136;
                      local_13c8[1] = auVar139;
                      uVar52 = auVar121._0_8_;
                      local_13c8 = local_13c8 + 2;
                    }
                    else {
                      lVar58 = 0;
                      if (uVar55 != 0) {
                        for (; (uVar55 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                        }
                      }
                      auVar66._4_4_ = auVar63._8_4_;
                      auVar66._0_4_ = auVar63._8_4_;
                      auVar66._8_4_ = auVar63._8_4_;
                      auVar66._12_4_ = auVar63._8_4_;
                      auVar157 = blendvps(auVar122,auVar91,auVar66);
                      auVar136 = blendvps(auVar91,auVar122,auVar66);
                      auVar146._8_4_ = *(int *)(local_1288 + lVar58 * 4);
                      auVar146._0_8_ = *(undefined8 *)(uVar47 + lVar58 * 8);
                      auVar146._12_4_ = 0;
                      auVar67._8_4_ = -(uint)(iVar50 < *(int *)(local_1288 + lVar58 * 4));
                      auVar67._4_4_ = auVar67._8_4_;
                      auVar67._0_4_ = auVar67._8_4_;
                      auVar67._12_4_ = auVar67._8_4_;
                      auVar121 = blendvps(auVar146,auVar112,auVar67);
                      auVar139 = blendvps(auVar112,auVar146,auVar67);
                      auVar68._8_4_ = -(uint)(auVar136._8_4_ < auVar139._8_4_);
                      auVar68._4_4_ = auVar68._8_4_;
                      auVar68._0_4_ = auVar68._8_4_;
                      auVar68._12_4_ = auVar68._8_4_;
                      auVar168 = blendvps(auVar139,auVar136,auVar68);
                      auVar136 = blendvps(auVar136,auVar139,auVar68);
                      auVar69._8_4_ = -(uint)(auVar157._8_4_ < auVar121._8_4_);
                      auVar69._4_4_ = auVar69._8_4_;
                      auVar69._0_4_ = auVar69._8_4_;
                      auVar69._12_4_ = auVar69._8_4_;
                      auVar139 = blendvps(auVar121,auVar157,auVar69);
                      auVar157 = blendvps(auVar157,auVar121,auVar69);
                      auVar70._8_4_ = -(uint)(auVar157._8_4_ < auVar168._8_4_);
                      auVar70._4_4_ = auVar70._8_4_;
                      auVar70._0_4_ = auVar70._8_4_;
                      auVar70._12_4_ = auVar70._8_4_;
                      auVar121 = blendvps(auVar168,auVar157,auVar70);
                      auVar157 = blendvps(auVar157,auVar168,auVar70);
                      *local_13c8 = auVar136;
                      local_13c8[1] = auVar157;
                      local_13c8[2] = auVar121;
                      uVar52 = auVar139._0_8_;
                      local_13c8 = local_13c8 + 3;
                      fVar186 = local_11a8;
                      fVar110 = fStack_11a4;
                      fVar163 = fStack_11a0;
                      fVar169 = fStack_119c;
                      fVar171 = local_11b8;
                      fVar190 = fStack_11b4;
                      fVar152 = fStack_11b0;
                      fVar153 = fStack_11ac;
                    }
                  }
                }
              }
            }
            else {
              iVar46 = 6;
            }
          } while (iVar46 == 0);
        } while (iVar46 != 6);
        local_1110 = (ulong)((uint)uVar52 & 0xf) - 8;
        if (local_1110 != 0) {
          local_10d8 = 0;
          local_1290 = uVar52 & 0xfffffffffffffff0;
          do {
            local_1320 = local_10d8 * 0x90;
            fVar110 = ((ray->super_RayK<1>).dir.field_0.m128[3] -
                      *(float *)(local_1290 + 0x80 + local_1320)) *
                      *(float *)(local_1290 + 0x84 + local_1320);
            uVar52 = *(ulong *)(local_1290 + 0x20 + local_1320);
            auVar92._8_8_ = 0;
            auVar92._0_8_ = uVar52;
            uVar47 = *(ulong *)(local_1290 + 0x24 + local_1320);
            auVar124._8_8_ = 0;
            auVar124._0_8_ = uVar47;
            bVar31 = (byte)uVar47;
            bVar61 = (byte)uVar52;
            bVar32 = (byte)(uVar47 >> 8);
            bVar81 = (byte)(uVar52 >> 8);
            bVar33 = (byte)(uVar47 >> 0x10);
            bVar82 = (byte)(uVar52 >> 0x10);
            bVar34 = (byte)(uVar47 >> 0x18);
            bVar83 = (byte)(uVar52 >> 0x18);
            bVar35 = (byte)(uVar47 >> 0x20);
            bVar84 = (byte)(uVar52 >> 0x20);
            bVar36 = (byte)(uVar47 >> 0x28);
            bVar86 = (byte)(uVar52 >> 0x28);
            bVar37 = (byte)(uVar47 >> 0x30);
            bVar87 = (byte)(uVar52 >> 0x30);
            bVar39 = (byte)(uVar52 >> 0x38);
            bVar38 = (byte)(uVar47 >> 0x38);
            auVar71[0] = -((byte)((bVar31 < bVar61) * bVar31 | (bVar31 >= bVar61) * bVar61) ==
                          bVar61);
            auVar71[1] = -((byte)((bVar32 < bVar81) * bVar32 | (bVar32 >= bVar81) * bVar81) ==
                          bVar81);
            auVar71[2] = -((byte)((bVar33 < bVar82) * bVar33 | (bVar33 >= bVar82) * bVar82) ==
                          bVar82);
            auVar71[3] = -((byte)((bVar34 < bVar83) * bVar34 | (bVar34 >= bVar83) * bVar83) ==
                          bVar83);
            auVar71[4] = -((byte)((bVar35 < bVar84) * bVar35 | (bVar35 >= bVar84) * bVar84) ==
                          bVar84);
            auVar71[5] = -((byte)((bVar36 < bVar86) * bVar36 | (bVar36 >= bVar86) * bVar86) ==
                          bVar86);
            auVar71[6] = -((byte)((bVar37 < bVar87) * bVar37 | (bVar37 >= bVar87) * bVar87) ==
                          bVar87);
            auVar71[7] = -((byte)((bVar38 < bVar39) * bVar38 | (bVar38 >= bVar39) * bVar39) ==
                          bVar39);
            auVar71[8] = 0xff;
            auVar71[9] = 0xff;
            auVar71[10] = 0xff;
            auVar71[0xb] = 0xff;
            auVar71[0xc] = 0xff;
            auVar71[0xd] = 0xff;
            auVar71[0xe] = 0xff;
            auVar71[0xf] = 0xff;
            auVar137 = pmovzxbd(auVar92,auVar92);
            fVar145 = *(float *)(local_1290 + 0x38 + local_1320);
            fVar175 = *(float *)(local_1290 + 0x3c + local_1320);
            fVar192 = *(float *)(local_1290 + 0x40 + local_1320);
            fVar89 = *(float *)(local_1290 + 0x44 + local_1320);
            fVar177 = (float)auVar137._0_4_ * fVar89 + fVar145;
            fVar182 = (float)auVar137._4_4_ * fVar89 + fVar145;
            fVar186 = (float)auVar137._8_4_ * fVar89 + fVar145;
            fVar190 = (float)auVar137._12_4_ * fVar89 + fVar145;
            auVar93._8_8_ = 0;
            auVar93._0_8_ = *(ulong *)(local_1290 + 0x50 + local_1320);
            auVar137 = pmovzxbd(auVar93,auVar93);
            fVar154 = *(float *)(local_1290 + 0x74 + local_1320);
            fVar159 = *(float *)(local_1290 + 0x68 + local_1320);
            auVar136 = pmovzxbd(auVar124,auVar124);
            fVar178 = (float)auVar136._0_4_ * fVar89 + fVar145;
            fVar183 = (float)auVar136._4_4_ * fVar89 + fVar145;
            fVar187 = (float)auVar136._8_4_ * fVar89 + fVar145;
            fVar145 = (float)auVar136._12_4_ * fVar89 + fVar145;
            auVar125._8_8_ = 0;
            auVar125._0_8_ = *(ulong *)(local_1290 + 0x54 + local_1320);
            auVar136 = pmovzxbd(auVar125,auVar125);
            auVar147._8_8_ = 0;
            auVar147._0_8_ = *(ulong *)(local_1290 + 0x28 + local_1320);
            auVar139 = pmovzxbd(auVar147,auVar147);
            fVar89 = *(float *)(local_1290 + 0x48 + local_1320);
            fVar163 = (float)auVar139._0_4_ * fVar89 + fVar175;
            fVar169 = (float)auVar139._4_4_ * fVar89 + fVar175;
            fVar171 = (float)auVar139._8_4_ * fVar89 + fVar175;
            fVar174 = (float)auVar139._12_4_ * fVar89 + fVar175;
            auVar148._8_8_ = 0;
            auVar148._0_8_ = *(ulong *)(local_1290 + 0x58 + local_1320);
            auVar121 = pmovzxbd(auVar148,auVar148);
            fVar173 = *(float *)(local_1290 + 0x78 + local_1320);
            fVar176 = *(float *)(local_1290 + 0x6c + local_1320);
            auVar165._8_8_ = 0;
            auVar165._0_8_ = *(ulong *)(local_1290 + 0x2c + local_1320);
            auVar139 = pmovzxbd(auVar165,auVar165);
            fVar164 = (float)auVar139._0_4_ * fVar89 + fVar175;
            fVar170 = (float)auVar139._4_4_ * fVar89 + fVar175;
            fVar172 = (float)auVar139._8_4_ * fVar89 + fVar175;
            fVar175 = (float)auVar139._12_4_ * fVar89 + fVar175;
            auVar156._8_8_ = 0;
            auVar156._0_8_ = *(ulong *)(local_1290 + 0x5c + local_1320);
            auVar157 = pmovzxbd(auVar156,auVar156);
            auVar166._8_8_ = 0;
            auVar166._0_8_ = *(ulong *)(local_1290 + 0x30 + local_1320);
            auVar139 = pmovzxbd(auVar166,auVar166);
            fVar89 = *(float *)(local_1290 + 0x4c + local_1320);
            fVar179 = (float)auVar139._0_4_ * fVar89 + fVar192;
            fVar184 = (float)auVar139._4_4_ * fVar89 + fVar192;
            fVar188 = (float)auVar139._8_4_ * fVar89 + fVar192;
            fVar191 = (float)auVar139._12_4_ * fVar89 + fVar192;
            auVar167._8_8_ = 0;
            auVar167._0_8_ = *(ulong *)(local_1290 + 0x60 + local_1320);
            auVar168 = pmovzxbd(auVar167,auVar167);
            fVar85 = *(float *)(local_1290 + 0x7c + local_1320);
            fVar88 = *(float *)(local_1290 + 0x70 + local_1320);
            auVar181._8_8_ = 0;
            auVar181._0_8_ = *(ulong *)(local_1290 + 0x34 + local_1320);
            auVar139 = pmovzxbd(auVar181,auVar181);
            fVar180 = (float)auVar139._0_4_ * fVar89 + fVar192;
            fVar185 = (float)auVar139._4_4_ * fVar89 + fVar192;
            fVar189 = (float)auVar139._8_4_ * fVar89 + fVar192;
            fVar192 = (float)auVar139._12_4_ * fVar89 + fVar192;
            auVar141._8_8_ = 0;
            auVar141._0_8_ = *(ulong *)(local_1290 + 100 + local_1320);
            auVar139 = pmovzxbd(auVar141,auVar141);
            fVar89 = (((((float)auVar137._0_4_ * fVar154 + fVar159) - fVar177) * fVar110 + fVar177)
                     - local_11a8) * local_1088;
            fVar177 = (((((float)auVar137._4_4_ * fVar154 + fVar159) - fVar182) * fVar110 + fVar182)
                      - fStack_11a4) * fStack_1084;
            fVar182 = (((((float)auVar137._8_4_ * fVar154 + fVar159) - fVar186) * fVar110 + fVar186)
                      - fStack_11a0) * fStack_1080;
            fVar186 = (((((float)auVar137._12_4_ * fVar154 + fVar159) - fVar190) * fVar110 + fVar190
                       ) - fStack_119c) * fStack_107c;
            fVar190 = (((((float)auVar121._0_4_ * fVar173 + fVar176) - fVar163) * fVar110 + fVar163)
                      - local_11b8) * local_1098;
            fVar152 = (((((float)auVar121._4_4_ * fVar173 + fVar176) - fVar169) * fVar110 + fVar169)
                      - fStack_11b4) * fStack_1094;
            fVar153 = (((((float)auVar121._8_4_ * fVar173 + fVar176) - fVar171) * fVar110 + fVar171)
                      - fStack_11b0) * fStack_1090;
            fVar174 = (((((float)auVar121._12_4_ * fVar173 + fVar176) - fVar174) * fVar110 + fVar174
                       ) - fStack_11ac) * fStack_108c;
            fVar163 = (((((float)auVar136._0_4_ * fVar154 + fVar159) - fVar178) * fVar110 + fVar178)
                      - local_11a8) * local_10a8;
            fVar169 = (((((float)auVar136._4_4_ * fVar154 + fVar159) - fVar183) * fVar110 + fVar183)
                      - fStack_11a4) * fStack_10a4;
            fVar171 = (((((float)auVar136._8_4_ * fVar154 + fVar159) - fVar187) * fVar110 + fVar187)
                      - fStack_11a0) * fStack_10a0;
            fVar145 = (((((float)auVar136._12_4_ * fVar154 + fVar159) - fVar145) * fVar110 + fVar145
                       ) - fStack_119c) * fStack_109c;
            fVar154 = (((((float)auVar157._0_4_ * fVar173 + fVar176) - fVar164) * fVar110 + fVar164)
                      - local_11b8) * (float)local_1058._0_4_;
            fVar159 = (((((float)auVar157._4_4_ * fVar173 + fVar176) - fVar170) * fVar110 + fVar170)
                      - fStack_11b4) * (float)local_1058._4_4_;
            fVar164 = (((((float)auVar157._8_4_ * fVar173 + fVar176) - fVar172) * fVar110 + fVar172)
                      - fStack_11b0) * fStack_1050;
            fVar175 = (((((float)auVar157._12_4_ * fVar173 + fVar176) - fVar175) * fVar110 + fVar175
                       ) - fStack_11ac) * fStack_104c;
            uVar111 = (uint)((int)fVar163 < (int)fVar89) * (int)fVar163 |
                      (uint)((int)fVar163 >= (int)fVar89) * (int)fVar89;
            uVar117 = (uint)((int)fVar169 < (int)fVar177) * (int)fVar169 |
                      (uint)((int)fVar169 >= (int)fVar177) * (int)fVar177;
            uVar118 = (uint)((int)fVar171 < (int)fVar182) * (int)fVar171 |
                      (uint)((int)fVar171 >= (int)fVar182) * (int)fVar182;
            uVar119 = (uint)((int)fVar145 < (int)fVar186) * (int)fVar145 |
                      (uint)((int)fVar145 >= (int)fVar186) * (int)fVar186;
            uVar120 = (uint)((int)fVar163 < (int)fVar89) * (int)fVar89 |
                      (uint)((int)fVar163 >= (int)fVar89) * (int)fVar163;
            uVar133 = (uint)((int)fVar169 < (int)fVar177) * (int)fVar177 |
                      (uint)((int)fVar169 >= (int)fVar177) * (int)fVar169;
            uVar134 = (uint)((int)fVar171 < (int)fVar182) * (int)fVar182 |
                      (uint)((int)fVar171 >= (int)fVar182) * (int)fVar171;
            uVar135 = (uint)((int)fVar145 < (int)fVar186) * (int)fVar186 |
                      (uint)((int)fVar145 >= (int)fVar186) * (int)fVar145;
            uVar90 = (uint)((int)fVar154 < (int)fVar190) * (int)fVar154 |
                     (uint)((int)fVar154 >= (int)fVar190) * (int)fVar190;
            uVar107 = (uint)((int)fVar159 < (int)fVar152) * (int)fVar159 |
                      (uint)((int)fVar159 >= (int)fVar152) * (int)fVar152;
            uVar108 = (uint)((int)fVar164 < (int)fVar153) * (int)fVar164 |
                      (uint)((int)fVar164 >= (int)fVar153) * (int)fVar153;
            uVar109 = (uint)((int)fVar175 < (int)fVar174) * (int)fVar175 |
                      (uint)((int)fVar175 >= (int)fVar174) * (int)fVar174;
            uVar90 = ((int)uVar90 < (int)uVar111) * uVar111 | ((int)uVar90 >= (int)uVar111) * uVar90
            ;
            uVar107 = ((int)uVar107 < (int)uVar117) * uVar117 |
                      ((int)uVar107 >= (int)uVar117) * uVar107;
            uVar108 = ((int)uVar108 < (int)uVar118) * uVar118 |
                      ((int)uVar108 >= (int)uVar118) * uVar108;
            uVar109 = ((int)uVar109 < (int)uVar119) * uVar119 |
                      ((int)uVar109 >= (int)uVar119) * uVar109;
            uVar111 = (uint)((int)fVar154 < (int)fVar190) * (int)fVar190 |
                      (uint)((int)fVar154 >= (int)fVar190) * (int)fVar154;
            uVar117 = (uint)((int)fVar159 < (int)fVar152) * (int)fVar152 |
                      (uint)((int)fVar159 >= (int)fVar152) * (int)fVar159;
            uVar118 = (uint)((int)fVar164 < (int)fVar153) * (int)fVar153 |
                      (uint)((int)fVar164 >= (int)fVar153) * (int)fVar164;
            uVar119 = (uint)((int)fVar175 < (int)fVar174) * (int)fVar174 |
                      (uint)((int)fVar175 >= (int)fVar174) * (int)fVar175;
            fVar154 = (((((float)auVar168._0_4_ * fVar85 + fVar88) - fVar179) * fVar110 + fVar179) -
                      local_1068) * local_1048;
            fVar159 = (((((float)auVar168._4_4_ * fVar85 + fVar88) - fVar184) * fVar110 + fVar184) -
                      fStack_1064) * fStack_1044;
            fVar173 = (((((float)auVar168._8_4_ * fVar85 + fVar88) - fVar188) * fVar110 + fVar188) -
                      fStack_1060) * fStack_1040;
            fVar176 = (((((float)auVar168._12_4_ * fVar85 + fVar88) - fVar191) * fVar110 + fVar191)
                      - fStack_105c) * fStack_103c;
            fVar145 = (((((float)auVar139._0_4_ * fVar85 + fVar88) - fVar180) * fVar110 + fVar180) -
                      local_1068) * (float)local_1038._0_4_;
            fVar175 = (((((float)auVar139._4_4_ * fVar85 + fVar88) - fVar185) * fVar110 + fVar185) -
                      fStack_1064) * (float)local_1038._4_4_;
            fVar89 = (((((float)auVar139._8_4_ * fVar85 + fVar88) - fVar189) * fVar110 + fVar189) -
                     fStack_1060) * fStack_1030;
            fVar192 = (((((float)auVar139._12_4_ * fVar85 + fVar88) - fVar192) * fVar110 + fVar192)
                      - fStack_105c) * fStack_102c;
            uVar155 = ((int)uVar120 < (int)uVar111) * uVar120 |
                      ((int)uVar120 >= (int)uVar111) * uVar111;
            uVar160 = ((int)uVar133 < (int)uVar117) * uVar133 |
                      ((int)uVar133 >= (int)uVar117) * uVar117;
            uVar161 = ((int)uVar134 < (int)uVar118) * uVar134 |
                      ((int)uVar134 >= (int)uVar118) * uVar118;
            uVar162 = ((int)uVar135 < (int)uVar119) * uVar135 |
                      ((int)uVar135 >= (int)uVar119) * uVar119;
            uVar111 = (uint)((int)fVar145 < (int)fVar154) * (int)fVar145 |
                      (uint)((int)fVar145 >= (int)fVar154) * (int)fVar154;
            uVar117 = (uint)((int)fVar175 < (int)fVar159) * (int)fVar175 |
                      (uint)((int)fVar175 >= (int)fVar159) * (int)fVar159;
            uVar118 = (uint)((int)fVar89 < (int)fVar173) * (int)fVar89 |
                      (uint)((int)fVar89 >= (int)fVar173) * (int)fVar173;
            uVar119 = (uint)((int)fVar192 < (int)fVar176) * (int)fVar192 |
                      (uint)((int)fVar192 >= (int)fVar176) * (int)fVar176;
            uVar120 = (uint)((int)fVar145 < (int)fVar154) * (int)fVar154 |
                      (uint)((int)fVar145 >= (int)fVar154) * (int)fVar145;
            uVar133 = (uint)((int)fVar175 < (int)fVar159) * (int)fVar159 |
                      (uint)((int)fVar175 >= (int)fVar159) * (int)fVar175;
            uVar134 = (uint)((int)fVar89 < (int)fVar173) * (int)fVar173 |
                      (uint)((int)fVar89 >= (int)fVar173) * (int)fVar89;
            uVar135 = (uint)((int)fVar192 < (int)fVar176) * (int)fVar176 |
                      (uint)((int)fVar192 >= (int)fVar176) * (int)fVar192;
            uVar111 = (uint)((int)uVar111 < (int)local_1078._0_4_) * local_1078._0_4_ |
                      ((int)uVar111 >= (int)local_1078._0_4_) * uVar111;
            uVar117 = (uint)((int)uVar117 < (int)local_1078._4_4_) * local_1078._4_4_ |
                      ((int)uVar117 >= (int)local_1078._4_4_) * uVar117;
            uVar118 = (uint)((int)uVar118 < (int)local_1078._8_4_) * local_1078._8_4_ |
                      ((int)uVar118 >= (int)local_1078._8_4_) * uVar118;
            uVar119 = (uint)((int)uVar119 < (int)local_1078._12_4_) * local_1078._12_4_ |
                      ((int)uVar119 >= (int)local_1078._12_4_) * uVar119;
            local_f88 = (float)(((int)uVar111 < (int)uVar90) * uVar90 |
                               ((int)uVar111 >= (int)uVar90) * uVar111);
            uStack_f84 = ((int)uVar117 < (int)uVar107) * uVar107 |
                         ((int)uVar117 >= (int)uVar107) * uVar117;
            uStack_f80 = ((int)uVar118 < (int)uVar108) * uVar108 |
                         ((int)uVar118 >= (int)uVar108) * uVar118;
            uStack_f7c = ((int)uVar119 < (int)uVar109) * uVar109 |
                         ((int)uVar119 >= (int)uVar109) * uVar119;
            uVar90 = (uint)((int)local_1198._0_4_ < (int)uVar120) * local_1198._0_4_ |
                     ((int)local_1198._0_4_ >= (int)uVar120) * uVar120;
            uVar107 = (uint)((int)local_1198._4_4_ < (int)uVar133) * local_1198._4_4_ |
                      ((int)local_1198._4_4_ >= (int)uVar133) * uVar133;
            uVar108 = (uint)((int)fStack_1190 < (int)uVar134) * (int)fStack_1190 |
                      ((int)fStack_1190 >= (int)uVar134) * uVar134;
            uVar109 = (uint)((int)fStack_118c < (int)uVar135) * (int)fStack_118c |
                      ((int)fStack_118c >= (int)uVar135) * uVar135;
            auVar113._0_4_ =
                 -(uint)((int)(((int)uVar155 < (int)uVar90) * uVar155 |
                              ((int)uVar155 >= (int)uVar90) * uVar90) < (int)local_f88);
            auVar113._4_4_ =
                 -(uint)((int)(((int)uVar160 < (int)uVar107) * uVar160 |
                              ((int)uVar160 >= (int)uVar107) * uVar107) < (int)uStack_f84);
            auVar113._8_4_ =
                 -(uint)((int)(((int)uVar161 < (int)uVar108) * uVar161 |
                              ((int)uVar161 >= (int)uVar108) * uVar108) < (int)uStack_f80);
            auVar113._12_4_ =
                 -(uint)((int)(((int)uVar162 < (int)uVar109) * uVar162 |
                              ((int)uVar162 >= (int)uVar109) * uVar109) < (int)uStack_f7c);
            auVar137 = pmovsxbd(auVar71,auVar71);
            uVar90 = movmskps((int)local_1320,~auVar113 & auVar137);
            if (uVar90 != 0) {
              local_1320 = local_1320 + local_1290;
              local_10b0 = (ulong)(uVar90 & 0xff);
              do {
                lVar58 = 0;
                if (local_10b0 != 0) {
                  for (; (local_10b0 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                  }
                }
                fVar145 = (ray->super_RayK<1>).tfar;
                if ((&local_f88)[lVar58] <= fVar145) {
                  local_1178 = ZEXT416((uint)fVar145);
                  uVar17 = *(ushort *)(local_1320 + lVar58 * 8);
                  uVar18 = *(ushort *)(local_1320 + 2 + lVar58 * 8);
                  fVar192 = *(float *)(local_1320 + 0x88);
                  uVar52 = (ulong)(uint)fVar192;
                  local_10b8 = uVar52;
                  fVar89 = *(float *)(local_1320 + 4 + lVar58 * 8);
                  local_10c8 = local_13c0->scene;
                  pGVar20 = (local_10c8->geometries).items[uVar52].ptr;
                  lVar58 = *(long *)&pGVar20->field_0x58;
                  local_1390 = (ulong)(uint)fVar89;
                  auVar54 = (undefined1  [8])
                            ((ulong)(uint)fVar89 *
                            pGVar20[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
                  fVar175 = (pGVar20->time_range).lower;
                  fVar175 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar175) /
                            ((pGVar20->time_range).upper - fVar175)) * pGVar20->fnumTimeSegments;
                  auVar114 = roundss(ZEXT816(0),ZEXT416((uint)fVar175),9);
                  fVar154 = pGVar20->fnumTimeSegments + -1.0;
                  if (fVar154 <= auVar114._0_4_) {
                    auVar114._0_4_ = fVar154;
                  }
                  fVar154 = 0.0;
                  if (0.0 <= auVar114._0_4_) {
                    fVar154 = auVar114._0_4_;
                  }
                  uVar107 = uVar17 & 0x7fff;
                  local_10c0 = lVar58;
                  uVar108 = uVar18 & 0x7fff;
                  uVar90 = *(uint *)(lVar58 + 4 + (long)auVar54);
                  uVar55 = (ulong)uVar90;
                  uVar59 = (ulong)(uVar90 * uVar108 + *(int *)(lVar58 + (long)auVar54) + uVar107);
                  lVar21 = *(long *)&pGVar20[2].numPrimitives;
                  lVar56 = (long)(int)fVar154 * 0x38;
                  lVar22 = *(long *)(lVar21 + 0x10 + lVar56);
                  lVar23 = *(long *)(lVar21 + lVar56);
                  puVar1 = (undefined8 *)(lVar23 + lVar22 * uVar59);
                  uVar19 = *puVar1;
                  lVar24 = *(long *)(lVar21 + 0x48 + lVar56);
                  pfVar12 = (float *)(lVar23 + (uVar59 + 1) * lVar22);
                  lVar57 = uVar55 + uVar59;
                  pfVar13 = (float *)(lVar23 + lVar57 * lVar22);
                  lVar60 = uVar55 + uVar59 + 1;
                  pfVar14 = (float *)(lVar23 + lVar60 * lVar22);
                  uVar47 = (ulong)(-1 < (short)uVar17);
                  lVar53 = uVar47 + uVar59 + 1;
                  pfVar15 = (float *)(lVar23 + lVar53 * lVar22);
                  lVar48 = uVar47 + lVar60;
                  pfVar2 = (float *)(lVar23 + lVar48 * lVar22);
                  uVar47 = 0;
                  if (-1 < (short)uVar18) {
                    uVar47 = uVar55;
                  }
                  pfVar3 = (float *)(lVar23 + (lVar57 + uVar47) * lVar22);
                  auVar51 = (undefined1  [8])(lVar24 * (lVar60 + uVar47));
                  pfVar4 = (float *)(lVar23 + (lVar60 + uVar47) * lVar22);
                  pfVar5 = (float *)(lVar23 + lVar22 * (uVar47 + lVar48));
                  fVar159 = *pfVar5;
                  fVar173 = pfVar5[1];
                  lVar21 = *(long *)(lVar21 + 0x38 + lVar56);
                  pfVar5 = (float *)(lVar21 + lVar24 * uVar59);
                  pfVar6 = (float *)(lVar21 + lVar24 * (uVar59 + 1));
                  pfVar7 = (float *)(lVar21 + lVar24 * lVar57);
                  pfVar8 = (float *)(lVar21 + lVar24 * lVar60);
                  pfVar9 = (float *)(lVar21 + lVar24 * lVar53);
                  fVar175 = fVar175 - fVar154;
                  pfVar10 = (float *)(lVar21 + lVar24 * lVar48);
                  local_13a8 = SUB84(uVar19,0);
                  auStack_13a4._0_4_ = (undefined4)((ulong)uVar19 >> 0x20);
                  auStack_13a4._4_4_ = (undefined4)puVar1[1];
                  local_1188 = (pfVar5[2] - (float)auStack_13a4._4_4_) * fVar175 +
                               (float)auStack_13a4._4_4_;
                  pfVar11 = (float *)(lVar21 + lVar24 * (lVar57 + uVar47));
                  fVar174 = (*pfVar6 - *pfVar12) * fVar175 + *pfVar12;
                  local_1158 = (pfVar6[1] - pfVar12[1]) * fVar175 + pfVar12[1];
                  fVar204 = (pfVar6[2] - pfVar12[2]) * fVar175 + pfVar12[2];
                  pfVar12 = (float *)((long)((RTCRayQueryContext *)auVar51)->instID + lVar21);
                  local_1358._0_4_ = (*pfVar7 - *pfVar13) * fVar175 + *pfVar13;
                  fVar177 = (pfVar7[1] - pfVar13[1]) * fVar175 + pfVar13[1];
                  local_1348._0_4_ = (pfVar7[2] - pfVar13[2]) * fVar175 + pfVar13[2];
                  pfVar13 = (float *)(lVar21 + (uVar47 + lVar48) * lVar24);
                  local_1358._4_4_ = (*pfVar8 - *pfVar14) * fVar175 + *pfVar14;
                  local_1128 = (pfVar8[1] - pfVar14[1]) * fVar175 + pfVar14[1];
                  local_1348._4_4_ = (pfVar8[2] - pfVar14[2]) * fVar175 + pfVar14[2];
                  fVar164 = (*pfVar9 - *pfVar15) * fVar175 + *pfVar15;
                  fStack_1154 = (pfVar9[1] - pfVar15[1]) * fVar175 + pfVar15[1];
                  fVar189 = (pfVar9[2] - pfVar15[2]) * fVar175 + pfVar15[2];
                  fVar170 = (*pfVar10 - *pfVar2) * fVar175 + *pfVar2;
                  fStack_1124 = (pfVar10[1] - pfVar2[1]) * fVar175 + pfVar2[1];
                  local_1138 = (pfVar10[2] - pfVar2[2]) * fVar175 + pfVar2[2];
                  fStack_139c = (pfVar11[1] - pfVar3[1]) * fVar175 + pfVar3[1];
                  fVar182 = (pfVar11[2] - pfVar3[2]) * fVar175 + pfVar3[2];
                  fStack_1294 = (*pfVar12 - *pfVar4) * fVar175 + *pfVar4;
                  fStack_111c = (pfVar12[1] - pfVar4[1]) * fVar175 + pfVar4[1];
                  fVar169 = (pfVar12[2] - pfVar4[2]) * fVar175 + pfVar4[2];
                  local_12a8 = CONCAT44(fVar170,local_1358._4_4_);
                  fStack_1298 = (*pfVar13 - fVar159) * fVar175 + fVar159;
                  fStack_1120 = (pfVar13[1] - fVar173) * fVar175 + fVar173;
                  fVar154 = *(float *)local_13b4._4_8_;
                  fVar159 = *(float *)(local_13b4._4_8_ + 4);
                  fVar173 = *(float *)(local_13b4._4_8_ + 8);
                  local_1368[0] =
                       (uint)(((*pfVar5 - (float)local_13a8) * fVar175 + (float)local_13a8) -
                             fVar154);
                  auStack_1364[0] = (uint)(fVar174 - fVar154);
                  fStack_1360 = (float)local_1358._4_4_ - fVar154;
                  fStack_135c = (float)local_1358._0_4_ - fVar154;
                  local_1168 = CONCAT44(fVar164,fVar174);
                  fVar174 = fVar174 - fVar154;
                  fVar164 = fVar164 - fVar154;
                  fVar170 = fVar170 - fVar154;
                  fVar172 = (float)local_1358._4_4_ - fVar154;
                  fVar176 = (float)local_1358._0_4_ - fVar154;
                  fVar85 = (float)local_1358._4_4_ - fVar154;
                  fVar88 = fStack_1294 - fVar154;
                  fVar154 = ((*pfVar11 - *pfVar3) * fVar175 + *pfVar3) - fVar154;
                  local_f98 = ((pfVar5[1] - (float)auStack_13a4._0_4_) * fVar175 +
                              (float)auStack_13a4._0_4_) - fVar159;
                  fStack_f94 = local_1158 - fVar159;
                  fStack_f90 = local_1128 - fVar159;
                  fStack_f8c = fVar177 - fVar159;
                  fStack_1150 = fStack_1124;
                  fStack_114c = local_1128;
                  fVar184 = local_1158 - fVar159;
                  fVar187 = fStack_1154 - fVar159;
                  fVar191 = fStack_1124 - fVar159;
                  fVar200 = local_1128 - fVar159;
                  auStack_13a4._0_4_ = local_1128;
                  local_13a8 = (undefined1  [4])fVar177;
                  auStack_13a4._4_4_ = fStack_111c;
                  fVar177 = fVar177 - fVar159;
                  fVar175 = local_1128 - fVar159;
                  fVar186 = fStack_111c - fVar159;
                  fVar159 = fStack_139c - fVar159;
                  local_1188 = local_1188 - fVar173;
                  fStack_1184 = fVar204 - fVar173;
                  fStack_1180 = (float)local_1348._4_4_ - fVar173;
                  fStack_117c = (float)local_1348._0_4_ - fVar173;
                  local_1148 = CONCAT44(fVar189,fVar204);
                  fStack_1134 = (float)local_1348._4_4_;
                  fVar204 = fVar204 - fVar173;
                  fVar189 = fVar189 - fVar173;
                  fVar205 = local_1138 - fVar173;
                  fVar206 = (float)local_1348._4_4_ - fVar173;
                  local_1338._4_4_ = fVar182;
                  local_1338._0_4_ = fVar169;
                  fVar110 = (float)local_1348._0_4_ - fVar173;
                  fVar163 = (float)local_1348._4_4_ - fVar173;
                  fVar169 = fVar169 - fVar173;
                  fVar182 = fVar182 - fVar173;
                  local_fc8 = fVar177 - local_f98;
                  fStack_fc4 = fVar175 - fStack_f94;
                  fStack_fc0 = fVar186 - fStack_f90;
                  fStack_fbc = fVar159 - fStack_f8c;
                  local_fa8 = fVar110 - local_1188;
                  fStack_fa4 = fVar163 - fStack_1184;
                  fStack_fa0 = fVar169 - fStack_1180;
                  fStack_f9c = fVar182 - fStack_117c;
                  local_fb8 = fVar176 - (float)local_1368[0];
                  fStack_fb4 = fVar85 - (float)auStack_1364[0];
                  fStack_fb0 = fVar88 - fStack_1360;
                  fStack_fac = fVar154 - fStack_135c;
                  fVar173 = (((Vec3ff *)(local_13b4._4_8_ + 0x10))->field_0).m128[0];
                  local_1388._4_4_ = *(float *)(local_13b4._4_8_ + 0x14);
                  local_12b8._4_4_ = *(float *)(local_13b4._4_8_ + 0x18);
                  local_1378._0_4_ =
                       (local_fc8 * (fVar110 + local_1188) - local_fa8 * (fVar177 + local_f98)) *
                       fVar173 + (local_fa8 * (fVar176 + (float)local_1368[0]) -
                                 (fVar110 + local_1188) * local_fb8) * (float)local_1388._4_4_ +
                                 ((fVar177 + local_f98) * local_fb8 -
                                 (fVar176 + (float)local_1368[0]) * local_fc8) *
                                 (float)local_12b8._4_4_;
                  local_1378._4_4_ =
                       (fStack_fc4 * (fVar163 + fStack_1184) - fStack_fa4 * (fVar175 + fStack_f94))
                       * fVar173 +
                       (fStack_fa4 * (fVar85 + (float)auStack_1364[0]) -
                       (fVar163 + fStack_1184) * fStack_fb4) * (float)local_1388._4_4_ +
                       ((fVar175 + fStack_f94) * fStack_fb4 -
                       (fVar85 + (float)auStack_1364[0]) * fStack_fc4) * (float)local_12b8._4_4_;
                  fStack_1370 = (fStack_fc0 * (fVar169 + fStack_1180) -
                                fStack_fa0 * (fVar186 + fStack_f90)) * fVar173 +
                                (fStack_fa0 * (fVar88 + fStack_1360) -
                                (fVar169 + fStack_1180) * fStack_fb0) * (float)local_1388._4_4_ +
                                ((fVar186 + fStack_f90) * fStack_fb0 -
                                (fVar88 + fStack_1360) * fStack_fc0) * (float)local_12b8._4_4_;
                  fStack_136c = (fStack_fbc * (fVar182 + fStack_117c) -
                                fStack_f9c * (fVar159 + fStack_f8c)) * fVar173 +
                                (fStack_f9c * (fVar154 + fStack_135c) -
                                (fVar182 + fStack_117c) * fStack_fac) * (float)local_1388._4_4_ +
                                ((fVar159 + fStack_f8c) * fStack_fac -
                                (fVar154 + fStack_135c) * fStack_fbc) * (float)local_12b8._4_4_;
                  fVar217 = local_f98 - fVar184;
                  fVar221 = fStack_f94 - fVar187;
                  fVar222 = fStack_f90 - fVar191;
                  fVar223 = fStack_f8c - fVar200;
                  fVar178 = local_1188 - fVar204;
                  fVar179 = fStack_1184 - fVar189;
                  fVar180 = fStack_1180 - fVar205;
                  fVar183 = fStack_117c - fVar206;
                  fVar207 = (float)local_1368[0] - fVar174;
                  fVar209 = (float)auStack_1364[0] - fVar164;
                  fVar210 = fStack_1360 - fVar170;
                  fVar211 = fStack_135c - fVar172;
                  auVar212._0_4_ =
                       (fVar217 * (local_1188 + fVar204) - fVar178 * (local_f98 + fVar184)) *
                       fVar173 + (fVar178 * ((float)local_1368[0] + fVar174) -
                                 (local_1188 + fVar204) * fVar207) * (float)local_1388._4_4_ +
                                 ((local_f98 + fVar184) * fVar207 -
                                 ((float)local_1368[0] + fVar174) * fVar217) *
                                 (float)local_12b8._4_4_;
                  auVar212._4_4_ =
                       (fVar221 * (fStack_1184 + fVar189) - fVar179 * (fStack_f94 + fVar187)) *
                       fVar173 + (fVar179 * ((float)auStack_1364[0] + fVar164) -
                                 (fStack_1184 + fVar189) * fVar209) * (float)local_1388._4_4_ +
                                 ((fStack_f94 + fVar187) * fVar209 -
                                 ((float)auStack_1364[0] + fVar164) * fVar221) *
                                 (float)local_12b8._4_4_;
                  auVar212._8_4_ =
                       (fVar222 * (fStack_1180 + fVar205) - fVar180 * (fStack_f90 + fVar191)) *
                       fVar173 + (fVar180 * (fStack_1360 + fVar170) -
                                 (fStack_1180 + fVar205) * fVar210) * (float)local_1388._4_4_ +
                                 ((fStack_f90 + fVar191) * fVar210 -
                                 (fStack_1360 + fVar170) * fVar222) * (float)local_12b8._4_4_;
                  auVar212._12_4_ =
                       (fVar223 * (fStack_117c + fVar206) - fVar183 * (fStack_f8c + fVar200)) *
                       fVar173 + (fVar183 * (fStack_135c + fVar172) -
                                 (fStack_117c + fVar206) * fVar211) * (float)local_1388._4_4_ +
                                 ((fStack_f8c + fVar200) * fVar211 -
                                 (fStack_135c + fVar172) * fVar223) * (float)local_12b8._4_4_;
                  fVar171 = fVar174 - fVar176;
                  fVar190 = fVar164 - fVar85;
                  fVar152 = fVar170 - fVar88;
                  fVar153 = fVar172 - fVar154;
                  fVar185 = fVar184 - fVar177;
                  fVar188 = fVar187 - fVar175;
                  fVar199 = fVar191 - fVar186;
                  fVar201 = fVar200 - fVar159;
                  local_fd8 = fVar204 - fVar110;
                  fStack_fd4 = fVar189 - fVar163;
                  fStack_fd0 = fVar205 - fVar169;
                  fStack_fcc = fVar206 - fVar182;
                  local_12b8._0_4_ = local_12b8._4_4_;
                  fStack_12b0 = (float)local_12b8._4_4_;
                  fStack_12ac = (float)local_12b8._4_4_;
                  local_1388._0_4_ = local_1388._4_4_;
                  fStack_1380 = (float)local_1388._4_4_;
                  fStack_137c = (float)local_1388._4_4_;
                  auVar202._0_4_ =
                       (fVar185 * (fVar110 + fVar204) - local_fd8 * (fVar177 + fVar184)) * fVar173 +
                       (local_fd8 * (fVar176 + fVar174) - (fVar110 + fVar204) * fVar171) *
                       (float)local_1388._4_4_ +
                       ((fVar177 + fVar184) * fVar171 - (fVar176 + fVar174) * fVar185) *
                       (float)local_12b8._4_4_;
                  auVar202._4_4_ =
                       (fVar188 * (fVar163 + fVar189) - fStack_fd4 * (fVar175 + fVar187)) * fVar173
                       + (fStack_fd4 * (fVar85 + fVar164) - (fVar163 + fVar189) * fVar190) *
                         (float)local_1388._4_4_ +
                         ((fVar175 + fVar187) * fVar190 - (fVar85 + fVar164) * fVar188) *
                         (float)local_12b8._4_4_;
                  auVar202._8_4_ =
                       (fVar199 * (fVar169 + fVar205) - fStack_fd0 * (fVar186 + fVar191)) * fVar173
                       + (fStack_fd0 * (fVar88 + fVar170) - (fVar169 + fVar205) * fVar152) *
                         (float)local_1388._4_4_ +
                         ((fVar186 + fVar191) * fVar152 - (fVar88 + fVar170) * fVar199) *
                         (float)local_12b8._4_4_;
                  auVar202._12_4_ =
                       (fVar201 * (fVar182 + fVar206) - fStack_fcc * (fVar159 + fVar200)) * fVar173
                       + (fStack_fcc * (fVar154 + fVar172) - (fVar182 + fVar206) * fVar153) *
                         (float)local_1388._4_4_ +
                         ((fVar159 + fVar200) * fVar153 - (fVar154 + fVar172) * fVar201) *
                         (float)local_12b8._4_4_;
                  fVar154 = (float)local_1378._0_4_ + auVar212._0_4_ + auVar202._0_4_;
                  fVar159 = (float)local_1378._4_4_ + auVar212._4_4_ + auVar202._4_4_;
                  fVar176 = fStack_1370 + auVar212._8_4_ + auVar202._8_4_;
                  fVar85 = fStack_136c + auVar212._12_4_ + auVar202._12_4_;
                  auVar137 = minps(_local_1378,auVar212);
                  auVar137 = minps(auVar137,auVar202);
                  auVar136 = maxps(_local_1378,auVar212);
                  auVar136 = maxps(auVar136,auVar202);
                  local_1018 = ABS(fVar154);
                  fStack_1014 = ABS(fVar159);
                  fStack_1010 = ABS(fVar176);
                  fStack_100c = ABS(fVar85);
                  local_1258 = &local_13c9;
                  auVar218._0_4_ =
                       -(uint)(auVar136._0_4_ <= local_1018 * 1.1920929e-07 ||
                              -(local_1018 * 1.1920929e-07) <= auVar137._0_4_) & local_1028;
                  auVar218._4_4_ =
                       -(uint)(auVar136._4_4_ <= fStack_1014 * 1.1920929e-07 ||
                              -(fStack_1014 * 1.1920929e-07) <= auVar137._4_4_) & uStack_1024;
                  auVar218._8_4_ =
                       -(uint)(auVar136._8_4_ <= fStack_1010 * 1.1920929e-07 ||
                              -(fStack_1010 * 1.1920929e-07) <= auVar137._8_4_) & uStack_1020;
                  auVar218._12_4_ =
                       -(uint)(auVar136._12_4_ <= fStack_100c * 1.1920929e-07 ||
                              -(fStack_100c * 1.1920929e-07) <= auVar137._12_4_) & uStack_101c;
                  fVar175 = (float)movmskps((int)lVar21,auVar218);
                  local_11d8 = ZEXT416(uVar108);
                  local_11c8 = ZEXT416(uVar107);
                  ray = (RayHit *)local_13b4._4_8_;
                  if (fVar175 != 0.0) {
                    local_fe8 = auVar212;
                    local_ff8 = fVar154;
                    fStack_ff4 = fVar159;
                    fStack_ff0 = fVar176;
                    fStack_fec = fVar85;
                    local_1008 = fVar185;
                    fStack_1004 = fVar188;
                    fStack_1000 = fVar199;
                    fStack_ffc = fVar201;
                    auVar126._0_4_ = local_fc8 * fVar178 - local_fa8 * fVar217;
                    auVar126._4_4_ = fStack_fc4 * fVar179 - fStack_fa4 * fVar221;
                    auVar126._8_4_ = fStack_fc0 * fVar180 - fStack_fa0 * fVar222;
                    auVar126._12_4_ = fStack_fbc * fVar183 - fStack_f9c * fVar223;
                    auVar197._0_4_ = fVar217 * local_fd8 - fVar178 * fVar185;
                    auVar197._4_4_ = fVar221 * fStack_fd4 - fVar179 * fVar188;
                    auVar197._8_4_ = fVar222 * fStack_fd0 - fVar180 * fVar199;
                    auVar197._12_4_ = fVar223 * fStack_fcc - fVar183 * fVar201;
                    auVar72._4_4_ = -(uint)(ABS(fStack_fa4 * fVar221) < ABS(fVar179 * fVar188));
                    auVar72._0_4_ = -(uint)(ABS(local_fa8 * fVar217) < ABS(fVar178 * fVar185));
                    auVar72._8_4_ = -(uint)(ABS(fStack_fa0 * fVar222) < ABS(fVar180 * fVar199));
                    auVar72._12_4_ = -(uint)(ABS(fStack_f9c * fVar223) < ABS(fVar183 * fVar201));
                    local_1268._4_4_ = fVar159;
                    local_1268._0_4_ = fVar154;
                    local_1268._8_4_ = fVar176;
                    local_1268._12_4_ = fVar85;
                    local_1208 = blendvps(auVar197,auVar126,auVar72);
                    auVar213._0_4_ = local_fa8 * fVar207 - local_fb8 * fVar178;
                    auVar213._4_4_ = fStack_fa4 * fVar209 - fStack_fb4 * fVar179;
                    auVar213._8_4_ = fStack_fa0 * fVar210 - fStack_fb0 * fVar180;
                    auVar213._12_4_ = fStack_f9c * fVar211 - fStack_fac * fVar183;
                    auVar149._0_4_ = fVar178 * fVar171 - fVar207 * local_fd8;
                    auVar149._4_4_ = fVar179 * fVar190 - fVar209 * fStack_fd4;
                    auVar149._8_4_ = fVar180 * fVar152 - fVar210 * fStack_fd0;
                    auVar149._12_4_ = fVar183 * fVar153 - fVar211 * fStack_fcc;
                    auVar73._4_4_ = -(uint)(ABS(fStack_fb4 * fVar179) < ABS(fVar209 * fStack_fd4));
                    auVar73._0_4_ = -(uint)(ABS(local_fb8 * fVar178) < ABS(fVar207 * local_fd8));
                    auVar73._8_4_ = -(uint)(ABS(fStack_fb0 * fVar180) < ABS(fVar210 * fStack_fd0));
                    auVar73._12_4_ = -(uint)(ABS(fStack_fac * fVar183) < ABS(fVar211 * fStack_fcc));
                    local_11f8 = blendvps(auVar149,auVar213,auVar73);
                    auVar142._0_4_ = local_fb8 * fVar217 - local_fc8 * fVar207;
                    auVar142._4_4_ = fStack_fb4 * fVar221 - fStack_fc4 * fVar209;
                    auVar142._8_4_ = fStack_fb0 * fVar222 - fStack_fc0 * fVar210;
                    auVar142._12_4_ = fStack_fac * fVar223 - fStack_fbc * fVar211;
                    auVar208._0_4_ = fVar207 * fVar185 - fVar217 * fVar171;
                    auVar208._4_4_ = fVar209 * fVar188 - fVar221 * fVar190;
                    auVar208._8_4_ = fVar210 * fVar199 - fVar222 * fVar152;
                    auVar208._12_4_ = fVar211 * fVar201 - fVar223 * fVar153;
                    auVar74._4_4_ = -(uint)(ABS(fStack_fc4 * fVar209) < ABS(fVar221 * fVar190));
                    auVar74._0_4_ = -(uint)(ABS(local_fc8 * fVar207) < ABS(fVar217 * fVar171));
                    auVar74._8_4_ = -(uint)(ABS(fStack_fc0 * fVar210) < ABS(fVar222 * fVar152));
                    auVar74._12_4_ = -(uint)(ABS(fStack_fbc * fVar211) < ABS(fVar223 * fVar153));
                    local_11e8 = blendvps(auVar208,auVar142,auVar74);
                    fVar171 = local_11f8._4_4_;
                    fVar190 = local_11f8._8_4_;
                    fVar152 = local_11f8._12_4_;
                    fVar88 = fVar173 * local_1208._0_4_ +
                             (float)local_1388._4_4_ * local_11f8._0_4_ +
                             (float)local_12b8._4_4_ * local_11e8._0_4_;
                    fVar177 = fVar173 * local_1208._4_4_ +
                              (float)local_1388._4_4_ * fVar171 +
                              (float)local_12b8._4_4_ * local_11e8._4_4_;
                    fVar182 = fVar173 * local_1208._8_4_ +
                              (float)local_1388._4_4_ * fVar190 +
                              (float)local_12b8._4_4_ * local_11e8._8_4_;
                    fVar173 = fVar173 * local_1208._12_4_ +
                              (float)local_1388._4_4_ * fVar152 +
                              (float)local_12b8._4_4_ * local_11e8._12_4_;
                    auVar193._0_4_ = fVar88 + fVar88;
                    auVar193._4_4_ = fVar177 + fVar177;
                    auVar193._8_4_ = fVar182 + fVar182;
                    auVar193._12_4_ = fVar173 + fVar173;
                    auVar94._0_4_ = local_f98 * local_11f8._0_4_ + local_1188 * local_11e8._0_4_;
                    auVar94._4_4_ = fStack_f94 * fVar171 + fStack_1184 * local_11e8._4_4_;
                    auVar94._8_4_ = fStack_f90 * fVar190 + fStack_1180 * local_11e8._8_4_;
                    auVar94._12_4_ = fStack_f8c * fVar152 + fStack_117c * local_11e8._12_4_;
                    fVar186 = (float)local_1368[0] * local_1208._0_4_ + auVar94._0_4_;
                    fVar110 = (float)auStack_1364[0] * local_1208._4_4_ + auVar94._4_4_;
                    fVar163 = fStack_1360 * local_1208._8_4_ + auVar94._8_4_;
                    fVar169 = fStack_135c * local_1208._12_4_ + auVar94._12_4_;
                    auVar137 = rcpps(auVar94,auVar193);
                    fVar173 = auVar137._0_4_;
                    fVar88 = auVar137._4_4_;
                    fVar177 = auVar137._8_4_;
                    fVar182 = auVar137._12_4_;
                    local_1218[0] =
                         ((1.0 - auVar193._0_4_ * fVar173) * fVar173 + fVar173) *
                         (fVar186 + fVar186);
                    local_1218[1] =
                         ((1.0 - auVar193._4_4_ * fVar88) * fVar88 + fVar88) * (fVar110 + fVar110);
                    local_1218[2] =
                         ((1.0 - auVar193._8_4_ * fVar177) * fVar177 + fVar177) *
                         (fVar163 + fVar163);
                    local_1218[3] =
                         ((1.0 - auVar193._12_4_ * fVar182) * fVar182 + fVar182) *
                         (fVar169 + fVar169);
                    fVar173 = *(float *)(local_13b4._4_8_ + 0xc);
                    auVar194._0_4_ =
                         (int)((uint)((local_1218[0] <= fVar145 && fVar173 <= local_1218[0]) &&
                                     auVar193._0_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar194._4_4_ =
                         (int)((uint)((local_1218[1] <= fVar145 && fVar173 <= local_1218[1]) &&
                                     auVar193._4_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar194._8_4_ =
                         (int)((uint)((local_1218[2] <= fVar145 && fVar173 <= local_1218[2]) &&
                                     auVar193._8_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar194._12_4_ =
                         (int)((uint)((local_1218[3] <= fVar145 && fVar173 <= local_1218[3]) &&
                                     auVar193._12_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar195 = auVar194 & auVar218;
                    fVar175 = (float)movmskps(fVar175,auVar195);
                    if (fVar175 != 0.0) {
                      local_1248 = auVar195;
                      fVar145 = (float)(int)(*(ushort *)(lVar58 + 8 + (long)auVar54) - 1);
                      auVar137 = rcpss(ZEXT416((uint)fVar145),ZEXT416((uint)fVar145));
                      auVar150._4_12_ = local_11f8._4_12_;
                      auVar150._0_4_ = (float)(int)(*(ushort *)(lVar58 + 10 + (long)auVar54) - 1);
                      fVar145 = (2.0 - fVar145 * auVar137._0_4_) * auVar137._0_4_;
                      auVar143._4_4_ = fVar171;
                      auVar143._0_4_ = auVar150._0_4_;
                      auVar143._8_4_ = fVar190;
                      auVar143._12_4_ = fVar152;
                      auVar137 = rcpss(auVar143,auVar150);
                      fStack_126c = (2.0 - auVar150._0_4_ * auVar137._0_4_) * auVar137._0_4_;
                      auVar127._0_4_ = (float)uVar107 * fVar154 + (float)local_1378._0_4_;
                      auVar127._4_4_ = (float)(uVar107 + 1) * fVar159 + (float)local_1378._4_4_;
                      auVar127._8_4_ = (float)(uVar107 + 1) * fVar176 + fStack_1370;
                      auVar127._12_4_ = (float)uVar107 * fVar85 + fStack_136c;
                      local_1288._4_4_ = fVar145 * auVar127._4_4_;
                      local_1288._0_4_ = fVar145 * auVar127._0_4_;
                      fStack_1280 = fVar145 * auVar127._8_4_;
                      fStack_127c = fVar145 * auVar127._12_4_;
                      local_1278._0_4_ = fStack_126c * ((float)uVar108 * fVar154 + auVar212._0_4_);
                      local_1278._4_4_ = fStack_126c * ((float)uVar108 * fVar159 + auVar212._4_4_);
                      fStack_1270 = fStack_126c * ((float)(uVar108 + 1) * fVar176 + auVar212._8_4_);
                      fStack_126c = fStack_126c * ((float)(uVar108 + 1) * fVar85 + auVar212._12_4_);
                      pGVar20 = (local_10c8->geometries).items[uVar52].ptr;
                      fVar175 = *(float *)(local_13b4._4_8_ + 0x24);
                      if ((pGVar20->mask & (uint)fVar175) != 0) {
                        auVar137 = rcpps(auVar127,local_1268);
                        fVar173 = auVar137._0_4_;
                        fVar88 = auVar137._4_4_;
                        fVar177 = auVar137._8_4_;
                        fVar182 = auVar137._12_4_;
                        fVar154 = (float)(-(uint)(1e-18 <= local_1018) &
                                         (uint)(((float)DAT_01feca10 - fVar154 * fVar173) * fVar173
                                               + fVar173));
                        fVar159 = (float)(-(uint)(1e-18 <= fStack_1014) &
                                         (uint)((DAT_01feca10._4_4_ - fVar159 * fVar88) * fVar88 +
                                               fVar88));
                        fVar173 = (float)(-(uint)(1e-18 <= fStack_1010) &
                                         (uint)((DAT_01feca10._8_4_ - fVar176 * fVar177) * fVar177 +
                                               fVar177));
                        fVar176 = (float)(-(uint)(1e-18 <= fStack_100c) &
                                         (uint)((DAT_01feca10._12_4_ - fVar85 * fVar182) * fVar182 +
                                               fVar182));
                        auVar95._0_4_ = fVar145 * auVar127._0_4_ * fVar154;
                        auVar95._4_4_ = fVar145 * auVar127._4_4_ * fVar159;
                        auVar95._8_4_ = fVar145 * auVar127._8_4_ * fVar173;
                        auVar95._12_4_ = fVar145 * auVar127._12_4_ * fVar176;
                        local_1238 = minps(auVar95,_DAT_01feca10);
                        auVar115._0_4_ = (float)local_1278._0_4_ * fVar154;
                        auVar115._4_4_ = (float)local_1278._4_4_ * fVar159;
                        auVar115._8_4_ = fStack_1270 * fVar173;
                        auVar115._12_4_ = fStack_126c * fVar176;
                        local_1228 = minps(auVar115,_DAT_01feca10);
                        auVar40._4_4_ = local_1218[1];
                        auVar40._0_4_ = local_1218[0];
                        auVar40._8_4_ = local_1218[2];
                        auVar40._12_4_ = local_1218[3];
                        auVar136 = blendvps(_DAT_01feb9f0,auVar40,auVar195);
                        _local_1338 = auVar195;
                        auVar128._4_4_ = auVar136._0_4_;
                        auVar128._0_4_ = auVar136._4_4_;
                        auVar128._8_4_ = auVar136._12_4_;
                        auVar128._12_4_ = auVar136._8_4_;
                        auVar137 = minps(auVar128,auVar136);
                        auVar96._0_8_ = auVar137._8_8_;
                        auVar96._8_4_ = auVar137._0_4_;
                        auVar96._12_4_ = auVar137._4_4_;
                        auVar137 = minps(auVar96,auVar137);
                        auVar97._0_8_ =
                             CONCAT44(-(uint)(auVar137._4_4_ == auVar136._4_4_) & auVar195._4_4_,
                                      -(uint)(auVar137._0_4_ == auVar136._0_4_) & auVar195._0_4_);
                        auVar97._8_4_ = -(uint)(auVar137._8_4_ == auVar136._8_4_) & auVar195._8_4_;
                        auVar97._12_4_ =
                             -(uint)(auVar137._12_4_ == auVar136._12_4_) & auVar195._12_4_;
                        iVar46 = movmskps(fVar175,auVar97);
                        if (iVar46 != 0) {
                          auVar195._8_4_ = auVar97._8_4_;
                          auVar195._0_8_ = auVar97._0_8_;
                          auVar195._12_4_ = auVar97._12_4_;
                        }
                        uVar90 = movmskps(iVar46,auVar195);
                        lVar57 = 0;
                        if (uVar90 != 0) {
                          for (; (uVar90 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
                          }
                        }
                        pRVar25 = local_13c0->args;
                        if ((pRVar25->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          fVar145 = *(float *)(local_1238 + lVar57 * 4);
                          fVar175 = local_1218[lVar57 + -4];
                          fVar154 = *(float *)(local_1208 + lVar57 * 4);
                          fVar159 = *(float *)(local_11f8 + lVar57 * 4);
                          fVar173 = *(float *)(local_11e8 + lVar57 * 4);
                          *(float *)(local_13b4._4_8_ + 0x20) = local_1218[lVar57];
                          (((Vec3f *)(local_13b4._4_8_ + 0x30))->field_0).field_0.x = fVar154;
                          *(float *)(local_13b4._4_8_ + 0x34) = fVar159;
                          *(float *)(local_13b4._4_8_ + 0x38) = fVar173;
                          *(float *)(local_13b4._4_8_ + 0x3c) = fVar145;
                          *(float *)(local_13b4._4_8_ + 0x40) = fVar175;
                          *(float *)(local_13b4._4_8_ + 0x44) = fVar89;
                          *(float *)(local_13b4._4_8_ + 0x48) = fVar192;
                          pRVar26 = local_13c0->user;
                          fVar145 = (float)pRVar26->instID[0];
                          auVar51 = (undefined1  [8])(ulong)(uint)fVar145;
                          *(float *)(local_13b4._4_8_ + 0x4c) = fVar145;
                          fVar175 = (float)pRVar26->instPrimID[0];
                          *(float *)(local_13b4._4_8_ + 0x50) = fVar175;
                        }
                        else {
                          local_1378 = (undefined1  [8])local_13c0->user;
                          local_1388 = auVar54;
                          do {
                            local_12dc = *(undefined4 *)(local_1238 + lVar57 * 4);
                            local_12d8 = local_1218[lVar57 + -4];
                            local_1368[0] = (uint)(ray->super_RayK<1>).tfar;
                            (ray->super_RayK<1>).tfar = local_1218[lVar57];
                            local_12e8 = *(float *)(local_1208 + lVar57 * 4);
                            local_12e4 = *(undefined4 *)(local_11f8 + lVar57 * 4);
                            local_12e0 = *(undefined4 *)(local_11e8 + lVar57 * 4);
                            local_12d4 = (int)local_1390;
                            local_12d0 = fVar192;
                            local_12cc = *(uint *)local_1378;
                            local_12c8 = *(uint *)((long)local_1378 + 4);
                            local_13b4._0_4_ = -NAN;
                            local_1318.valid = (int *)local_13b4;
                            local_1318.geometryUserPtr = pGVar20->userPtr;
                            local_1318.context = (RTCRayQueryContext *)local_1378;
                            local_1318.ray = (RTCRayN *)ray;
                            local_1318.hit = (RTCHitN *)&local_12e8;
                            local_1318.N = 1;
                            auVar51 = local_1378;
                            if (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e9511b:
                              if (pRVar25->filter != (RTCFilterFunctionN)0x0) {
                                if (((pRVar25->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar20->field_8).field_0x2 & 0x40) != 0)) {
                                  (*pRVar25->filter)(&local_1318);
                                  auVar54 = local_1388;
                                  ray = (RayHit *)local_13b4._4_8_;
                                }
                                if ((((RayK<1> *)local_1318.valid)->org).field_0.m128[0] == 0.0)
                                goto LAB_00e951b8;
                              }
                              (((Vec3f *)((long)local_1318.ray + 0x30))->field_0).field_0.x =
                                   *(float *)local_1318.hit;
                              (((Vec3f *)((long)local_1318.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_1318.hit + 4);
                              (((Vec3f *)((long)local_1318.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_1318.hit + 8);
                              *(float *)((long)local_1318.ray + 0x3c) =
                                   *(float *)(local_1318.hit + 0xc);
                              *(float *)((long)local_1318.ray + 0x40) =
                                   *(float *)(local_1318.hit + 0x10);
                              *(float *)((long)local_1318.ray + 0x44) =
                                   *(float *)(local_1318.hit + 0x14);
                              *(float *)((long)local_1318.ray + 0x48) =
                                   *(float *)(local_1318.hit + 0x18);
                              *(float *)((long)local_1318.ray + 0x4c) =
                                   *(float *)(local_1318.hit + 0x1c);
                              auVar51 = (undefined1  [8])
                                        (ulong)(uint)*(float *)(local_1318.hit + 0x20);
                              *(float *)((long)local_1318.ray + 0x50) =
                                   *(float *)(local_1318.hit + 0x20);
                              pRVar49 = (RayHit *)local_1318.ray;
                            }
                            else {
                              (*pGVar20->intersectionFilterN)(&local_1318);
                              auVar54 = local_1388;
                              ray = (RayHit *)local_13b4._4_8_;
                              if ((((RayK<1> *)local_1318.valid)->org).field_0.m128[0] != 0.0)
                              goto LAB_00e9511b;
LAB_00e951b8:
                              (ray->super_RayK<1>).tfar = (float)local_1368[0];
                              pRVar49 = (RayHit *)local_1318.valid;
                            }
                            *(undefined4 *)(local_1338 + lVar57 * 4) = 0;
                            fVar145 = (ray->super_RayK<1>).tfar;
                            auVar42._4_4_ = local_1218[1];
                            auVar42._0_4_ = local_1218[0];
                            auVar42._8_4_ = local_1218[2];
                            auVar42._12_4_ = local_1218[3];
                            auVar79._0_4_ = -(uint)(local_1218[0] <= fVar145) & local_1338._0_4_;
                            auVar79._4_4_ = -(uint)(local_1218[1] <= fVar145) & local_1338._4_4_;
                            auVar79._8_4_ = -(uint)(local_1218[2] <= fVar145) & uStack_1330;
                            auVar79._12_4_ = -(uint)(local_1218[3] <= fVar145) & uStack_132c;
                            _local_1338 = auVar79;
                            fVar175 = (float)movmskps((int)pRVar49,auVar79);
                            if (fVar175 != 0.0) {
                              auVar136 = blendvps(_DAT_01feb9f0,auVar42,auVar79);
                              auVar131._4_4_ = auVar136._0_4_;
                              auVar131._0_4_ = auVar136._4_4_;
                              auVar131._8_4_ = auVar136._12_4_;
                              auVar131._12_4_ = auVar136._8_4_;
                              auVar137 = minps(auVar131,auVar136);
                              auVar103._0_8_ = auVar137._8_8_;
                              auVar103._8_4_ = auVar137._0_4_;
                              auVar103._12_4_ = auVar137._4_4_;
                              auVar137 = minps(auVar103,auVar137);
                              auVar104._0_8_ =
                                   CONCAT44(-(uint)(auVar137._4_4_ == auVar136._4_4_) &
                                            auVar79._4_4_,
                                            -(uint)(auVar137._0_4_ == auVar136._0_4_) &
                                            auVar79._0_4_);
                              auVar104._8_4_ =
                                   -(uint)(auVar137._8_4_ == auVar136._8_4_) & auVar79._8_4_;
                              auVar104._12_4_ =
                                   -(uint)(auVar137._12_4_ == auVar136._12_4_) & auVar79._12_4_;
                              iVar46 = movmskps(SUB84(auVar51,0),auVar104);
                              if (iVar46 != 0) {
                                auVar79._8_4_ = auVar104._8_4_;
                                auVar79._0_8_ = auVar104._0_8_;
                                auVar79._12_4_ = auVar104._12_4_;
                              }
                              uVar45 = movmskps(iVar46,auVar79);
                              auVar51 = (undefined1  [8])
                                        CONCAT44((int)((ulong)auVar51 >> 0x20),uVar45);
                              lVar57 = 0;
                              if (auVar51 != (undefined1  [8])0x0) {
                                for (; ((ulong)auVar51 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
                                }
                              }
                            }
                          } while (SUB41(fVar175,0) != '\0');
                        }
                      }
                    }
                  }
                  fVar145 = (ray->super_RayK<1>).org.field_0.m128[0];
                  fVar89 = (ray->super_RayK<1>).org.field_0.m128[1];
                  fVar154 = (ray->super_RayK<1>).org.field_0.m128[2];
                  fVar159 = (ray->super_RayK<1>).dir.field_0.m128[0];
                  fVar173 = (ray->super_RayK<1>).dir.field_0.m128[1];
                  local_1368[0] = (uint)(ray->super_RayK<1>).dir.field_0.m128[2];
                  local_12a8._0_4_ = (float)local_12a8 - fVar145;
                  local_12a8._4_4_ = local_12a8._4_4_ - fVar145;
                  fStack_12a0 = fStack_12a0 - fVar145;
                  fStack_129c = fStack_129c - fVar145;
                  local_1128 = local_1128 - fVar89;
                  fStack_1124 = fStack_1124 - fVar89;
                  fStack_1120 = fStack_1120 - fVar89;
                  fStack_111c = fStack_111c - fVar89;
                  local_1138 = local_1138 - fVar154;
                  fStack_1134 = fStack_1134 - fVar154;
                  fStack_1130 = fStack_1130 - fVar154;
                  fStack_112c = fStack_112c - fVar154;
                  fVar176 = (float)local_1358._0_4_ - fVar145;
                  fVar177 = (float)local_1358._4_4_ - fVar145;
                  fVar110 = fStack_1350 - fVar145;
                  fVar171 = fStack_134c - fVar145;
                  fVar85 = (float)local_13a8 - fVar89;
                  fVar182 = (float)auStack_13a4._0_4_ - fVar89;
                  fVar163 = (float)auStack_13a4._4_4_ - fVar89;
                  fVar190 = fStack_139c - fVar89;
                  fVar88 = (float)local_1348._0_4_ - fVar154;
                  fVar186 = (float)local_1348._4_4_ - fVar154;
                  fVar169 = fStack_1340 - fVar154;
                  fVar152 = fStack_133c - fVar154;
                  fVar207 = (float)local_1168 - fVar145;
                  fVar209 = local_1168._4_4_ - fVar145;
                  fVar210 = fStack_1160 - fVar145;
                  fVar145 = fStack_115c - fVar145;
                  fVar211 = local_1158 - fVar89;
                  fVar217 = fStack_1154 - fVar89;
                  fVar221 = fStack_1150 - fVar89;
                  fVar89 = fStack_114c - fVar89;
                  fVar185 = (float)local_1148 - fVar154;
                  fVar187 = local_1148._4_4_ - fVar154;
                  fVar188 = fStack_1140 - fVar154;
                  fVar154 = fStack_113c - fVar154;
                  fVar153 = fVar207 - (float)local_12a8;
                  fVar164 = fVar209 - local_12a8._4_4_;
                  fVar172 = fVar210 - fStack_12a0;
                  fVar179 = fVar145 - fStack_129c;
                  local_1158 = fVar211 - local_1128;
                  fStack_1154 = fVar217 - fStack_1124;
                  fStack_1150 = fVar221 - fStack_1120;
                  fStack_114c = fVar89 - fStack_111c;
                  fVar189 = fVar185 - local_1138;
                  fVar191 = fVar187 - fStack_1134;
                  fStack_1140 = fVar188 - fStack_1130;
                  fStack_113c = fVar154 - fStack_112c;
                  local_1148 = CONCAT44(fVar191,fVar189);
                  auStack_13a4._0_4_ = fVar173;
                  local_13a8 = (undefined1  [4])fVar173;
                  auStack_13a4._4_4_ = fVar173;
                  fStack_139c = fVar173;
                  auStack_1364[0] = local_1368[0];
                  fStack_1360 = (float)local_1368[0];
                  fStack_135c = (float)local_1368[0];
                  local_1378._4_4_ = fVar164;
                  local_1378._0_4_ = fVar153;
                  fStack_1370 = fVar172;
                  fStack_136c = fVar179;
                  fVar174 = local_1128 - fVar85;
                  fVar170 = fStack_1124 - fVar182;
                  fVar178 = fStack_1120 - fVar163;
                  fVar180 = fStack_111c - fVar190;
                  fVar201 = local_1138 - fVar88;
                  fVar204 = fStack_1134 - fVar186;
                  fVar205 = fStack_1130 - fVar169;
                  fVar206 = fStack_112c - fVar152;
                  fVar199 = (local_1158 * (fVar185 + local_1138) - fVar189 * (fVar211 + local_1128))
                            * fVar159 +
                            (fVar189 * (fVar207 + (float)local_12a8) -
                            (fVar185 + local_1138) * fVar153) * fVar173 +
                            ((fVar211 + local_1128) * fVar153 -
                            (fVar207 + (float)local_12a8) * local_1158) * (float)local_1368[0];
                  fVar200 = (fStack_1154 * (fVar187 + fStack_1134) -
                            fVar191 * (fVar217 + fStack_1124)) * fVar159 +
                            (fVar191 * (fVar209 + local_12a8._4_4_) -
                            (fVar187 + fStack_1134) * fVar164) * fVar173 +
                            ((fVar217 + fStack_1124) * fVar164 -
                            (fVar209 + local_12a8._4_4_) * fStack_1154) * (float)local_1368[0];
                  local_1348 = (undefined1  [8])CONCAT44(fVar200,fVar199);
                  fStack_1340 = (fStack_1150 * (fVar188 + fStack_1130) -
                                fStack_1140 * (fVar221 + fStack_1120)) * fVar159 +
                                (fStack_1140 * (fVar210 + fStack_12a0) -
                                (fVar188 + fStack_1130) * fVar172) * fVar173 +
                                ((fVar221 + fStack_1120) * fVar172 -
                                (fVar210 + fStack_12a0) * fStack_1150) * (float)local_1368[0];
                  fStack_133c = (fStack_114c * (fVar154 + fStack_112c) -
                                fStack_113c * (fVar89 + fStack_111c)) * fVar159 +
                                (fStack_113c * (fVar145 + fStack_129c) -
                                (fVar154 + fStack_112c) * fVar179) * fVar173 +
                                ((fVar89 + fStack_111c) * fVar179 -
                                (fVar145 + fStack_129c) * fStack_114c) * (float)local_1368[0];
                  fVar183 = (float)local_12a8 - fVar176;
                  fVar184 = local_12a8._4_4_ - fVar177;
                  fStack_1160 = fStack_12a0 - fVar110;
                  fStack_115c = fStack_129c - fVar171;
                  local_1168 = CONCAT44(fVar184,fVar183);
                  local_1358._0_4_ =
                       (fVar174 * (local_1138 + fVar88) - fVar201 * (local_1128 + fVar85)) * fVar159
                       + (fVar201 * ((float)local_12a8 + fVar176) - (local_1138 + fVar88) * fVar183)
                         * fVar173 +
                         ((local_1128 + fVar85) * fVar183 - ((float)local_12a8 + fVar176) * fVar174)
                         * (float)local_1368[0];
                  local_1358._4_4_ =
                       (fVar170 * (fStack_1134 + fVar186) - fVar204 * (fStack_1124 + fVar182)) *
                       fVar159 + (fVar204 * (local_12a8._4_4_ + fVar177) -
                                 (fStack_1134 + fVar186) * fVar184) * fVar173 +
                                 ((fStack_1124 + fVar182) * fVar184 -
                                 (local_12a8._4_4_ + fVar177) * fVar170) * (float)local_1368[0];
                  fStack_1350 = (fVar178 * (fStack_1130 + fVar169) -
                                fVar205 * (fStack_1120 + fVar163)) * fVar159 +
                                (fVar205 * (fStack_12a0 + fVar110) -
                                (fStack_1130 + fVar169) * fStack_1160) * fVar173 +
                                ((fStack_1120 + fVar163) * fStack_1160 -
                                (fStack_12a0 + fVar110) * fVar178) * (float)local_1368[0];
                  fStack_134c = (fVar180 * (fStack_112c + fVar152) -
                                fVar206 * (fStack_111c + fVar190)) * fVar159 +
                                (fVar206 * (fStack_129c + fVar171) -
                                (fStack_112c + fVar152) * fStack_115c) * fVar173 +
                                ((fStack_111c + fVar190) * fStack_115c -
                                (fStack_129c + fVar171) * fVar180) * (float)local_1368[0];
                  local_1378._0_4_ = fVar176 - fVar207;
                  local_1378._4_4_ = fVar177 - fVar209;
                  fStack_1370 = fVar110 - fVar210;
                  fStack_136c = fVar171 - fVar145;
                  local_12b8._0_4_ = fVar85 - fVar211;
                  local_12b8._4_4_ = fVar182 - fVar217;
                  fStack_12b0 = fVar163 - fVar221;
                  fStack_12ac = fVar190 - fVar89;
                  local_1178._0_4_ = fVar88 - fVar185;
                  local_1178._4_4_ = fVar186 - fVar187;
                  local_1178._8_4_ = fVar169 - fVar188;
                  local_1178._12_4_ = fVar152 - fVar154;
                  auVar75._0_4_ =
                       ((float)local_12b8._0_4_ * (fVar185 + fVar88) -
                       local_1178._0_4_ * (fVar211 + fVar85)) * fVar159 +
                       (local_1178._0_4_ * (fVar207 + fVar176) -
                       (fVar185 + fVar88) * (float)local_1378._0_4_) * fVar173 +
                       ((fVar211 + fVar85) * (float)local_1378._0_4_ -
                       (fVar207 + fVar176) * (float)local_12b8._0_4_) * (float)local_1368[0];
                  auVar75._4_4_ =
                       ((float)local_12b8._4_4_ * (fVar187 + fVar186) -
                       local_1178._4_4_ * (fVar217 + fVar182)) * fVar159 +
                       (local_1178._4_4_ * (fVar209 + fVar177) -
                       (fVar187 + fVar186) * (float)local_1378._4_4_) * fVar173 +
                       ((fVar217 + fVar182) * (float)local_1378._4_4_ -
                       (fVar209 + fVar177) * (float)local_12b8._4_4_) * (float)local_1368[0];
                  auVar75._8_4_ =
                       (fStack_12b0 * (fVar188 + fVar169) - local_1178._8_4_ * (fVar221 + fVar163))
                       * fVar159 +
                       (local_1178._8_4_ * (fVar210 + fVar110) - (fVar188 + fVar169) * fStack_1370)
                       * fVar173 +
                       ((fVar221 + fVar163) * fStack_1370 - (fVar210 + fVar110) * fStack_12b0) *
                       (float)local_1368[0];
                  auVar75._12_4_ =
                       (fStack_12ac * (fVar154 + fVar152) - local_1178._12_4_ * (fVar89 + fVar190))
                       * fVar159 +
                       (local_1178._12_4_ * (fVar145 + fVar171) - (fVar154 + fVar152) * fStack_136c)
                       * fVar173 +
                       ((fVar89 + fVar190) * fStack_136c - (fVar145 + fVar171) * fStack_12ac) *
                       (float)local_1368[0];
                  local_1388._0_4_ = fVar199 + (float)local_1358._0_4_ + auVar75._0_4_;
                  local_1388._4_4_ = fVar200 + (float)local_1358._4_4_ + auVar75._4_4_;
                  fStack_1380 = fStack_1340 + fStack_1350 + auVar75._8_4_;
                  fStack_137c = fStack_133c + fStack_134c + auVar75._12_4_;
                  auVar98._8_4_ = fStack_1340;
                  auVar98._0_8_ = local_1348;
                  auVar98._12_4_ = fStack_133c;
                  auVar137 = minps(auVar98,_local_1358);
                  auVar137 = minps(auVar137,auVar75);
                  auVar219._8_4_ = fStack_1340;
                  auVar219._0_8_ = local_1348;
                  auVar219._12_4_ = fStack_133c;
                  auVar136 = maxps(auVar219,_local_1358);
                  auVar136 = maxps(auVar136,auVar75);
                  local_1188 = ABS((float)local_1388._0_4_);
                  fStack_1184 = ABS((float)local_1388._4_4_);
                  fStack_1180 = ABS(fStack_1380);
                  fStack_117c = ABS(fStack_137c);
                  auVar220._0_4_ =
                       -(uint)(auVar136._0_4_ <= local_1188 * 1.1920929e-07 ||
                              -(local_1188 * 1.1920929e-07) <= auVar137._0_4_) & local_1028;
                  auVar220._4_4_ =
                       -(uint)(auVar136._4_4_ <= fStack_1184 * 1.1920929e-07 ||
                              -(fStack_1184 * 1.1920929e-07) <= auVar137._4_4_) & uStack_1024;
                  auVar220._8_4_ =
                       -(uint)(auVar136._8_4_ <= fStack_1180 * 1.1920929e-07 ||
                              -(fStack_1180 * 1.1920929e-07) <= auVar137._8_4_) & uStack_1020;
                  auVar220._12_4_ =
                       -(uint)(auVar136._12_4_ <= fStack_117c * 1.1920929e-07 ||
                              -(fStack_117c * 1.1920929e-07) <= auVar137._12_4_) & uStack_101c;
                  iVar46 = movmskps(fVar175,auVar220);
                  if (iVar46 != 0) {
                    auVar151._0_4_ = local_1158 * fVar201 - fVar189 * fVar174;
                    auVar151._4_4_ = fStack_1154 * fVar204 - fVar191 * fVar170;
                    auVar151._8_4_ = fStack_1150 * fVar205 - fStack_1140 * fVar178;
                    auVar151._12_4_ = fStack_114c * fVar206 - fStack_113c * fVar180;
                    auVar158._0_4_ = fVar174 * local_1178._0_4_ - fVar201 * (float)local_12b8._0_4_;
                    auVar158._4_4_ = fVar170 * local_1178._4_4_ - fVar204 * (float)local_12b8._4_4_;
                    auVar158._8_4_ = fVar178 * local_1178._8_4_ - fVar205 * fStack_12b0;
                    auVar158._12_4_ = fVar180 * local_1178._12_4_ - fVar206 * fStack_12ac;
                    auVar76._4_4_ =
                         -(uint)(ABS(fVar191 * fVar170) < ABS(fVar204 * (float)local_12b8._4_4_));
                    auVar76._0_4_ =
                         -(uint)(ABS(fVar189 * fVar174) < ABS(fVar201 * (float)local_12b8._0_4_));
                    auVar76._8_4_ = -(uint)(ABS(fStack_1140 * fVar178) < ABS(fVar205 * fStack_12b0))
                    ;
                    auVar76._12_4_ =
                         -(uint)(ABS(fStack_113c * fVar180) < ABS(fVar206 * fStack_12ac));
                    local_1208 = blendvps(auVar158,auVar151,auVar76);
                    auVar198._0_4_ = fVar189 * fVar183 - fVar153 * fVar201;
                    auVar198._4_4_ = fVar191 * fVar184 - fVar164 * fVar204;
                    auVar198._8_4_ = fStack_1140 * fStack_1160 - fVar172 * fVar205;
                    auVar198._12_4_ = fStack_113c * fStack_115c - fVar179 * fVar206;
                    auVar203._0_4_ = fVar201 * (float)local_1378._0_4_ - fVar183 * local_1178._0_4_;
                    auVar203._4_4_ = fVar204 * (float)local_1378._4_4_ - fVar184 * local_1178._4_4_;
                    auVar203._8_4_ = fVar205 * fStack_1370 - fStack_1160 * local_1178._8_4_;
                    auVar203._12_4_ = fVar206 * fStack_136c - fStack_115c * local_1178._12_4_;
                    auVar77._4_4_ =
                         -(uint)(ABS(fVar164 * fVar204) < ABS(fVar184 * local_1178._4_4_));
                    auVar77._0_4_ =
                         -(uint)(ABS(fVar153 * fVar201) < ABS(fVar183 * local_1178._0_4_));
                    auVar77._8_4_ =
                         -(uint)(ABS(fVar172 * fVar205) < ABS(fStack_1160 * local_1178._8_4_));
                    auVar77._12_4_ =
                         -(uint)(ABS(fVar179 * fVar206) < ABS(fStack_115c * local_1178._12_4_));
                    local_11f8 = blendvps(auVar203,auVar198,auVar77);
                    auVar196._0_4_ = fVar153 * fVar174 - local_1158 * fVar183;
                    auVar196._4_4_ = fVar164 * fVar170 - fStack_1154 * fVar184;
                    auVar196._8_4_ = fVar172 * fVar178 - fStack_1150 * fStack_1160;
                    auVar196._12_4_ = fVar179 * fVar180 - fStack_114c * fStack_115c;
                    auVar144._0_4_ =
                         fVar183 * (float)local_12b8._0_4_ - fVar174 * (float)local_1378._0_4_;
                    auVar144._4_4_ =
                         fVar184 * (float)local_12b8._4_4_ - fVar170 * (float)local_1378._4_4_;
                    auVar144._8_4_ = fStack_1160 * fStack_12b0 - fVar178 * fStack_1370;
                    auVar144._12_4_ = fStack_115c * fStack_12ac - fVar180 * fStack_136c;
                    auVar78._4_4_ =
                         -(uint)(ABS(fStack_1154 * fVar184) < ABS(fVar170 * (float)local_1378._4_4_)
                                );
                    auVar78._0_4_ =
                         -(uint)(ABS(local_1158 * fVar183) < ABS(fVar174 * (float)local_1378._0_4_))
                    ;
                    auVar78._8_4_ =
                         -(uint)(ABS(fStack_1150 * fStack_1160) < ABS(fVar178 * fStack_1370));
                    auVar78._12_4_ =
                         -(uint)(ABS(fStack_114c * fStack_115c) < ABS(fVar180 * fStack_136c));
                    local_11e8 = blendvps(auVar144,auVar196,auVar78);
                    auVar99._0_4_ =
                         fVar173 * local_11f8._0_4_ + (float)local_1368[0] * local_11e8._0_4_;
                    auVar99._4_4_ =
                         fVar173 * local_11f8._4_4_ + (float)local_1368[0] * local_11e8._4_4_;
                    auVar99._8_4_ =
                         fVar173 * local_11f8._8_4_ + (float)local_1368[0] * local_11e8._8_4_;
                    auVar99._12_4_ =
                         fVar173 * local_11f8._12_4_ + (float)local_1368[0] * local_11e8._12_4_;
                    fVar145 = fVar159 * local_1208._0_4_ + auVar99._0_4_;
                    fVar175 = fVar159 * local_1208._4_4_ + auVar99._4_4_;
                    fVar89 = fVar159 * local_1208._8_4_ + auVar99._8_4_;
                    fVar154 = fVar159 * local_1208._12_4_ + auVar99._12_4_;
                    auVar214._0_4_ = fVar145 + fVar145;
                    auVar214._4_4_ = fVar175 + fVar175;
                    auVar214._8_4_ = fVar89 + fVar89;
                    auVar214._12_4_ = fVar154 + fVar154;
                    fVar159 = (float)local_12a8 * local_1208._0_4_ +
                              local_1128 * local_11f8._0_4_ + local_1138 * local_11e8._0_4_;
                    fVar173 = local_12a8._4_4_ * local_1208._4_4_ +
                              fStack_1124 * local_11f8._4_4_ + fStack_1134 * local_11e8._4_4_;
                    fVar176 = fStack_12a0 * local_1208._8_4_ +
                              fStack_1120 * local_11f8._8_4_ + fStack_1130 * local_11e8._8_4_;
                    fVar85 = fStack_129c * local_1208._12_4_ +
                             fStack_111c * local_11f8._12_4_ + fStack_112c * local_11e8._12_4_;
                    auVar137 = rcpps(auVar99,auVar214);
                    fVar145 = auVar137._0_4_;
                    fVar175 = auVar137._4_4_;
                    fVar89 = auVar137._8_4_;
                    fVar154 = auVar137._12_4_;
                    local_1218[0] =
                         ((1.0 - auVar214._0_4_ * fVar145) * fVar145 + fVar145) *
                         (fVar159 + fVar159);
                    local_1218[1] =
                         ((1.0 - auVar214._4_4_ * fVar175) * fVar175 + fVar175) *
                         (fVar173 + fVar173);
                    local_1218[2] =
                         ((1.0 - auVar214._8_4_ * fVar89) * fVar89 + fVar89) * (fVar176 + fVar176);
                    local_1218[3] =
                         ((1.0 - auVar214._12_4_ * fVar154) * fVar154 + fVar154) * (fVar85 + fVar85)
                    ;
                    fVar145 = (ray->super_RayK<1>).tfar;
                    fVar175 = (ray->super_RayK<1>).org.field_0.m128[3];
                    auVar215._0_4_ =
                         (int)((uint)(auVar214._0_4_ != 0.0 &&
                                     (local_1218[0] <= fVar145 && fVar175 <= local_1218[0])) *
                              -0x80000000) >> 0x1f;
                    auVar215._4_4_ =
                         (int)((uint)(auVar214._4_4_ != 0.0 &&
                                     (local_1218[1] <= fVar145 && fVar175 <= local_1218[1])) *
                              -0x80000000) >> 0x1f;
                    auVar215._8_4_ =
                         (int)((uint)(auVar214._8_4_ != 0.0 &&
                                     (local_1218[2] <= fVar145 && fVar175 <= local_1218[2])) *
                              -0x80000000) >> 0x1f;
                    auVar215._12_4_ =
                         (int)((uint)(auVar214._12_4_ != 0.0 &&
                                     (local_1218[3] <= fVar145 && fVar175 <= local_1218[3])) *
                              -0x80000000) >> 0x1f;
                    auVar216 = auVar215 & auVar220;
                    iVar46 = movmskps(iVar46,auVar216);
                    if (iVar46 != 0) {
                      local_1268 = _local_1388;
                      local_1258 = &local_13c9;
                      local_1248 = auVar216;
                      fVar145 = (float)(int)(*(ushort *)(lVar58 + 8 + (long)auVar54) - 1);
                      auVar137 = rcpss(ZEXT416((uint)fVar145),ZEXT416((uint)fVar145));
                      fStack_127c = (2.0 - fVar145 * auVar137._0_4_) * auVar137._0_4_;
                      fVar145 = (float)(int)(*(ushort *)(lVar58 + 10 + (long)auVar54) - 1);
                      auVar137 = rcpss(ZEXT416((uint)fVar145),ZEXT416((uint)fVar145));
                      fVar145 = (2.0 - fVar145 * auVar137._0_4_) * auVar137._0_4_;
                      local_1288._0_4_ =
                           fStack_127c *
                           ((float)(int)local_11c8._0_4_ * (float)local_1388._0_4_ +
                           ((float)local_1388._0_4_ - fVar199));
                      local_1288._4_4_ =
                           fStack_127c *
                           ((float)(local_11c8._0_4_ + 1) * (float)local_1388._4_4_ +
                           ((float)local_1388._4_4_ - fVar200));
                      fStack_1280 = fStack_127c *
                                    ((float)(local_11c8._0_4_ + 1) * fStack_1380 +
                                    (fStack_1380 - fStack_1340));
                      fStack_127c = fStack_127c *
                                    ((float)(int)local_11c8._0_4_ * fStack_137c +
                                    (fStack_137c - fStack_133c));
                      auVar129._0_4_ =
                           (float)(int)local_11d8._0_4_ * (float)local_1388._0_4_ +
                           ((float)local_1388._0_4_ - (float)local_1358._0_4_);
                      auVar129._4_4_ =
                           (float)(int)local_11d8._0_4_ * (float)local_1388._4_4_ +
                           ((float)local_1388._4_4_ - (float)local_1358._4_4_);
                      auVar129._8_4_ =
                           (float)(local_11d8._0_4_ + 1) * fStack_1380 + (fStack_1380 - fStack_1350)
                      ;
                      auVar129._12_4_ =
                           (float)(local_11d8._0_4_ + 1) * fStack_137c + (fStack_137c - fStack_134c)
                      ;
                      local_1278._0_4_ = fVar145 * auVar129._0_4_;
                      local_1278._4_4_ = fVar145 * auVar129._4_4_;
                      fStack_1270 = fVar145 * auVar129._8_4_;
                      fStack_126c = fVar145 * auVar129._12_4_;
                      pGVar20 = (local_13c0->scene->geometries).items[uVar52].ptr;
                      uVar90 = (ray->super_RayK<1>).mask;
                      if ((pGVar20->mask & uVar90) != 0) {
                        auVar137 = rcpps(auVar129,_local_1388);
                        fVar145 = auVar137._0_4_;
                        fVar175 = auVar137._4_4_;
                        fVar89 = auVar137._8_4_;
                        fVar154 = auVar137._12_4_;
                        fVar145 = (float)(-(uint)(1e-18 <= local_1188) &
                                         (uint)(((float)DAT_01feca10 -
                                                (float)local_1388._0_4_ * fVar145) * fVar145 +
                                               fVar145));
                        fVar175 = (float)(-(uint)(1e-18 <= fStack_1184) &
                                         (uint)((DAT_01feca10._4_4_ -
                                                (float)local_1388._4_4_ * fVar175) * fVar175 +
                                               fVar175));
                        fVar89 = (float)(-(uint)(1e-18 <= fStack_1180) &
                                        (uint)((DAT_01feca10._8_4_ - fStack_1380 * fVar89) * fVar89
                                              + fVar89));
                        fVar154 = (float)(-(uint)(1e-18 <= fStack_117c) &
                                         (uint)((DAT_01feca10._12_4_ - fStack_137c * fVar154) *
                                                fVar154 + fVar154));
                        auVar100._0_4_ = (float)local_1288._0_4_ * fVar145;
                        auVar100._4_4_ = (float)local_1288._4_4_ * fVar175;
                        auVar100._8_4_ = fStack_1280 * fVar89;
                        auVar100._12_4_ = fStack_127c * fVar154;
                        local_1238 = minps(auVar100,_DAT_01feca10);
                        auVar116._0_4_ = (float)local_1278._0_4_ * fVar145;
                        auVar116._4_4_ = (float)local_1278._4_4_ * fVar175;
                        auVar116._8_4_ = fStack_1270 * fVar89;
                        auVar116._12_4_ = fStack_126c * fVar154;
                        local_1228 = minps(auVar116,_DAT_01feca10);
                        auVar41._4_4_ = local_1218[1];
                        auVar41._0_4_ = local_1218[0];
                        auVar41._8_4_ = local_1218[2];
                        auVar41._12_4_ = local_1218[3];
                        auVar136 = blendvps(_DAT_01feb9f0,auVar41,auVar216);
                        _local_1338 = auVar216;
                        auVar130._4_4_ = auVar136._0_4_;
                        auVar130._0_4_ = auVar136._4_4_;
                        auVar130._8_4_ = auVar136._12_4_;
                        auVar130._12_4_ = auVar136._8_4_;
                        auVar137 = minps(auVar130,auVar136);
                        auVar101._0_8_ = auVar137._8_8_;
                        auVar101._8_4_ = auVar137._0_4_;
                        auVar101._12_4_ = auVar137._4_4_;
                        auVar137 = minps(auVar101,auVar137);
                        auVar102._0_8_ =
                             CONCAT44(-(uint)(auVar137._4_4_ == auVar136._4_4_) & auVar216._4_4_,
                                      -(uint)(auVar137._0_4_ == auVar136._0_4_) & auVar216._0_4_);
                        auVar102._8_4_ = -(uint)(auVar137._8_4_ == auVar136._8_4_) & auVar216._8_4_;
                        auVar102._12_4_ =
                             -(uint)(auVar137._12_4_ == auVar136._12_4_) & auVar216._12_4_;
                        iVar46 = movmskps(uVar90,auVar102);
                        if (iVar46 != 0) {
                          auVar216._8_4_ = auVar102._8_4_;
                          auVar216._0_8_ = auVar102._0_8_;
                          auVar216._12_4_ = auVar102._12_4_;
                        }
                        uVar90 = movmskps(iVar46,auVar216);
                        lVar58 = 0;
                        if (uVar90 != 0) {
                          for (; (uVar90 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                          }
                        }
                        pRVar25 = local_13c0->args;
                        if ((pRVar25->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          fVar145 = *(float *)(local_1238 + lVar58 * 4);
                          fVar175 = local_1218[lVar58 + -4];
                          fVar89 = *(float *)(local_1208 + lVar58 * 4);
                          fVar154 = *(float *)(local_11f8 + lVar58 * 4);
                          fVar159 = *(float *)(local_11e8 + lVar58 * 4);
                          (ray->super_RayK<1>).tfar = local_1218[lVar58];
                          (ray->Ng).field_0.field_0.x = fVar89;
                          (ray->Ng).field_0.field_0.y = fVar154;
                          (ray->Ng).field_0.field_0.z = fVar159;
                          ray->u = fVar145;
                          ray->v = fVar175;
                          ray->primID = (uint)local_1390;
                          ray->geomID = (uint)fVar192;
                          pRVar26 = local_13c0->user;
                          ray->instID[0] = pRVar26->instID[0];
                          ray->instPrimID[0] = pRVar26->instPrimID[0];
                        }
                        else {
                          pRVar26 = local_13c0->user;
                          do {
                            local_12dc = *(undefined4 *)(local_1238 + lVar58 * 4);
                            local_12d8 = local_1218[lVar58 + -4];
                            local_13a8 = (undefined1  [4])(ray->super_RayK<1>).tfar;
                            (ray->super_RayK<1>).tfar = local_1218[lVar58];
                            local_12e8 = *(float *)(local_1208 + lVar58 * 4);
                            local_12e4 = *(undefined4 *)(local_11f8 + lVar58 * 4);
                            local_12e0 = *(undefined4 *)(local_11e8 + lVar58 * 4);
                            local_12d4 = (int)local_1390;
                            local_12d0 = fVar192;
                            local_12cc = pRVar26->instID[0];
                            local_12c8 = pRVar26->instPrimID[0];
                            local_13b4._0_4_ = -NAN;
                            local_1318.valid = (int *)local_13b4;
                            local_1318.geometryUserPtr = pGVar20->userPtr;
                            local_1318.context = pRVar26;
                            local_1318.ray = (RTCRayN *)ray;
                            local_1318.hit = (RTCHitN *)&local_12e8;
                            local_1318.N = 1;
                            if ((pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                               ((*pGVar20->intersectionFilterN)(&local_1318),
                               ray = (RayHit *)local_13b4._4_8_,
                               (((RayK<1> *)local_1318.valid)->org).field_0.m128[0] != 0.0)) {
                              if (pRVar25->filter != (RTCFilterFunctionN)0x0) {
                                if (((pRVar25->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar20->field_8).field_0x2 & 0x40) != 0)) {
                                  (*pRVar25->filter)(&local_1318);
                                  ray = (RayHit *)local_13b4._4_8_;
                                }
                                if ((((RayK<1> *)local_1318.valid)->org).field_0.m128[0] == 0.0)
                                goto LAB_00e953fe;
                              }
                              (((Vec3f *)((long)local_1318.ray + 0x30))->field_0).field_0.x =
                                   *(float *)local_1318.hit;
                              (((Vec3f *)((long)local_1318.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_1318.hit + 4);
                              (((Vec3f *)((long)local_1318.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_1318.hit + 8);
                              *(float *)((long)local_1318.ray + 0x3c) =
                                   *(float *)(local_1318.hit + 0xc);
                              *(float *)((long)local_1318.ray + 0x40) =
                                   *(float *)(local_1318.hit + 0x10);
                              *(float *)((long)local_1318.ray + 0x44) =
                                   *(float *)(local_1318.hit + 0x14);
                              *(float *)((long)local_1318.ray + 0x48) =
                                   *(float *)(local_1318.hit + 0x18);
                              *(float *)((long)local_1318.ray + 0x4c) =
                                   *(float *)(local_1318.hit + 0x1c);
                              auVar51 = (undefined1  [8])
                                        (ulong)(uint)*(float *)(local_1318.hit + 0x20);
                              *(float *)((long)local_1318.ray + 0x50) =
                                   *(float *)(local_1318.hit + 0x20);
                              pRVar49 = (RayHit *)local_1318.ray;
                            }
                            else {
LAB_00e953fe:
                              (ray->super_RayK<1>).tfar = (float)local_13a8;
                              pRVar49 = (RayHit *)local_1318.valid;
                            }
                            *(undefined4 *)(local_1338 + lVar58 * 4) = 0;
                            fVar145 = (ray->super_RayK<1>).tfar;
                            auVar43._4_4_ = local_1218[1];
                            auVar43._0_4_ = local_1218[0];
                            auVar43._8_4_ = local_1218[2];
                            auVar43._12_4_ = local_1218[3];
                            auVar80._0_4_ = -(uint)(local_1218[0] <= fVar145) & local_1338._0_4_;
                            auVar80._4_4_ = -(uint)(local_1218[1] <= fVar145) & local_1338._4_4_;
                            auVar80._8_4_ = -(uint)(local_1218[2] <= fVar145) & uStack_1330;
                            auVar80._12_4_ = -(uint)(local_1218[3] <= fVar145) & uStack_132c;
                            _local_1338 = auVar80;
                            iVar46 = movmskps((int)pRVar49,auVar80);
                            if (iVar46 != 0) {
                              auVar136 = blendvps(_DAT_01feb9f0,auVar43,auVar80);
                              auVar132._4_4_ = auVar136._0_4_;
                              auVar132._0_4_ = auVar136._4_4_;
                              auVar132._8_4_ = auVar136._12_4_;
                              auVar132._12_4_ = auVar136._8_4_;
                              auVar137 = minps(auVar132,auVar136);
                              auVar105._0_8_ = auVar137._8_8_;
                              auVar105._8_4_ = auVar137._0_4_;
                              auVar105._12_4_ = auVar137._4_4_;
                              auVar137 = minps(auVar105,auVar137);
                              auVar106._0_8_ =
                                   CONCAT44(-(uint)(auVar137._4_4_ == auVar136._4_4_) &
                                            auVar80._4_4_,
                                            -(uint)(auVar137._0_4_ == auVar136._0_4_) &
                                            auVar80._0_4_);
                              auVar106._8_4_ =
                                   -(uint)(auVar137._8_4_ == auVar136._8_4_) & auVar80._8_4_;
                              auVar106._12_4_ =
                                   -(uint)(auVar137._12_4_ == auVar136._12_4_) & auVar80._12_4_;
                              iVar50 = movmskps(SUB84(auVar51,0),auVar106);
                              if (iVar50 != 0) {
                                auVar80._8_4_ = auVar106._8_4_;
                                auVar80._0_8_ = auVar106._0_8_;
                                auVar80._12_4_ = auVar106._12_4_;
                              }
                              uVar45 = movmskps(iVar50,auVar80);
                              auVar51 = (undefined1  [8])
                                        CONCAT44((int)((ulong)auVar51 >> 0x20),uVar45);
                              lVar58 = 0;
                              if (auVar51 != (undefined1  [8])0x0) {
                                for (; ((ulong)auVar51 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                                }
                              }
                            }
                          } while ((char)iVar46 != '\0');
                        }
                      }
                    }
                  }
                }
                local_10b0 = local_10b0 & local_10b0 - 1;
              } while (local_10b0 != 0);
            }
            local_10d8 = local_10d8 + 1;
          } while (local_10d8 != local_1110);
        }
        local_1198._4_4_ = (ray->super_RayK<1>).tfar;
        local_1198._0_4_ = local_1198._4_4_;
        fStack_1190 = (float)local_1198._4_4_;
        fStack_118c = (float)local_1198._4_4_;
        auVar137 = local_1078;
        fVar145 = local_1098;
        fVar175 = fStack_1094;
        fVar192 = fStack_1090;
        fVar89 = fStack_108c;
        fVar154 = local_10a8;
        fVar159 = fStack_10a4;
        fVar173 = fStack_10a0;
        fVar176 = fStack_109c;
        fVar85 = local_1068;
        fVar88 = fStack_1064;
        fVar177 = fStack_1060;
        fVar182 = fStack_105c;
        fVar186 = local_11a8;
        fVar110 = fStack_11a4;
        fVar163 = fStack_11a0;
        fVar169 = fStack_119c;
        fVar171 = local_11b8;
        fVar190 = fStack_11b4;
        fVar152 = fStack_11b0;
        fVar153 = fStack_11ac;
        fVar174 = local_1088;
        fVar164 = fStack_1084;
        fVar170 = fStack_1080;
        fVar172 = fStack_107c;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }